

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O1

void embree::avx512::ConeCurveMiIntersectorK<8,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *line)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Scene *pSVar10;
  Geometry *pGVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  ulong uVar75;
  ulong uVar76;
  byte bVar77;
  byte bVar78;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  byte bVar89;
  byte bVar90;
  uint uVar91;
  uint uVar92;
  uint uVar93;
  byte bVar94;
  uint uVar95;
  ulong uVar96;
  ulong uVar97;
  ulong uVar98;
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [64];
  undefined1 auVar152 [32];
  undefined1 auVar153 [64];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [64];
  float fVar166;
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  float fVar167;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar169 [64];
  undefined1 auVar176 [32];
  undefined1 auVar177 [64];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  RTCFilterFunctionNArguments local_650;
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  uint local_5a0 [4];
  uint uStack_590;
  uint uStack_58c;
  uint uStack_588;
  uint uStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  uint local_540 [4];
  uint uStack_530;
  uint uStack_52c;
  uint uStack_528;
  uint uStack_524;
  uint local_520 [4];
  uint uStack_510;
  uint uStack_50c;
  uint uStack_508;
  uint uStack_504;
  uint local_500 [4];
  uint uStack_4f0;
  uint uStack_4ec;
  uint uStack_4e8;
  uint uStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  int local_340;
  int iStack_33c;
  int iStack_338;
  int iStack_334;
  int iStack_330;
  int iStack_32c;
  int iStack_328;
  int iStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  RTCHitN local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  uint local_c0;
  uint uStack_bc;
  uint uStack_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  int iVar99;
  int iVar135;
  int iVar136;
  int iVar137;
  int iVar138;
  int iVar139;
  int iVar140;
  int iVar141;
  undefined1 auVar168 [32];
  
  pSVar10 = context->scene;
  pGVar11 = (pSVar10->geometries).items[line->sharedGeomID].ptr;
  uVar95 = (line->v0).field_0.i[0];
  lVar12 = *(long *)&pGVar11[1].time_range.upper;
  p_Var13 = pGVar11[1].intersectionFilterN;
  uVar92 = (line->v0).field_0.i[1];
  uVar91 = (line->v0).field_0.i[2];
  uVar93 = (line->v0).field_0.i[3];
  uVar6 = (line->v0).field_0.i[4];
  auVar113._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar6 * (long)p_Var13);
  auVar113._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar95 * (long)p_Var13);
  uVar7 = (line->v0).field_0.i[5];
  auVar131._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar7 * (long)p_Var13);
  auVar131._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar92 * (long)p_Var13);
  uVar8 = (line->v0).field_0.i[6];
  auVar109._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar8 * (long)p_Var13);
  auVar109._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar91 * (long)p_Var13);
  uVar9 = (line->v0).field_0.i[7];
  auVar110._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar9 * (long)p_Var13);
  auVar110._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar93 * (long)p_Var13);
  auVar100 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar6 + 1) * (long)p_Var13);
  auVar124._0_16_ =
       ZEXT116(0) * auVar100 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar95 + 1) * (long)p_Var13);
  auVar124._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar100;
  auVar100 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar7 + 1) * (long)p_Var13);
  auVar154._0_16_ =
       ZEXT116(0) * auVar100 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar92 + 1) * (long)p_Var13);
  auVar154._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar100;
  auVar100 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar8 + 1) * (long)p_Var13);
  auVar156._0_16_ =
       ZEXT116(0) * auVar100 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar91 + 1) * (long)p_Var13);
  auVar156._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar100;
  auVar100 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar9 + 1) * (long)p_Var13);
  auVar158._0_16_ =
       ZEXT116(0) * auVar100 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar93 + 1) * (long)p_Var13);
  auVar158._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar100;
  local_1c0 = vpbroadcastd_avx512vl();
  auVar106 = vunpcklps_avx(auVar113,auVar109);
  auVar104 = vunpckhps_avx(auVar113,auVar109);
  auVar113 = vunpcklps_avx(auVar131,auVar110);
  auVar105 = vunpckhps_avx(auVar131,auVar110);
  auVar109 = vunpcklps_avx(auVar106,auVar113);
  auVar113 = vunpckhps_avx(auVar106,auVar113);
  auVar110 = vunpcklps_avx(auVar104,auVar105);
  auVar131 = vunpckhps_avx(auVar104,auVar105);
  auVar106 = vpunpckldq_avx2(auVar124,auVar156);
  auVar104 = vpunpckhdq_avx2(auVar124,auVar156);
  auVar124 = vpunpckldq_avx2(auVar154,auVar158);
  auVar105 = vpunpckhdq_avx2(auVar154,auVar158);
  auVar156 = vpunpckldq_avx2(auVar106,auVar124);
  auVar124 = vpunpckhdq_avx2(auVar106,auVar124);
  auVar158 = vpunpckldq_avx2(auVar104,auVar105);
  auVar154 = vpunpckhdq_avx2(auVar104,auVar105);
  auVar104 = vpcmpeqd_avx2(auVar106,auVar106);
  uVar76 = vpcmpd_avx512vl(auVar104,(undefined1  [32])(line->primIDs).field_0,4);
  fVar1 = *(float *)(ray + k * 4);
  auVar108._4_4_ = fVar1;
  auVar108._0_4_ = fVar1;
  auVar108._8_4_ = fVar1;
  auVar108._12_4_ = fVar1;
  auVar108._16_4_ = fVar1;
  auVar108._20_4_ = fVar1;
  auVar108._24_4_ = fVar1;
  auVar108._28_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x20);
  auVar111._4_4_ = fVar2;
  auVar111._0_4_ = fVar2;
  auVar111._8_4_ = fVar2;
  auVar111._12_4_ = fVar2;
  auVar111._16_4_ = fVar2;
  auVar111._20_4_ = fVar2;
  auVar111._24_4_ = fVar2;
  auVar111._28_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0x40);
  auVar112._4_4_ = fVar3;
  auVar112._0_4_ = fVar3;
  auVar112._8_4_ = fVar3;
  auVar112._12_4_ = fVar3;
  auVar112._16_4_ = fVar3;
  auVar112._20_4_ = fVar3;
  auVar112._24_4_ = fVar3;
  auVar112._28_4_ = fVar3;
  auVar101 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  auVar188 = ZEXT3264(auVar101);
  auVar102 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar189 = ZEXT3264(auVar102);
  auVar103 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar190 = ZEXT3264(auVar103);
  auVar100 = vmulss_avx512f(auVar103._0_16_,auVar103._0_16_);
  auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar100),auVar102,auVar102);
  auVar104 = vfmadd231ps_avx512vl(auVar104,auVar101,auVar101);
  auVar106._0_4_ = auVar104._0_4_;
  auVar106._4_4_ = auVar106._0_4_;
  auVar106._8_4_ = auVar106._0_4_;
  auVar106._12_4_ = auVar106._0_4_;
  auVar106._16_4_ = auVar106._0_4_;
  auVar106._20_4_ = auVar106._0_4_;
  auVar106._24_4_ = auVar106._0_4_;
  auVar106._28_4_ = auVar106._0_4_;
  auVar105 = vrcp14ps_avx512vl(auVar106);
  auVar104._8_4_ = 0x3f800000;
  auVar104._0_8_ = &DAT_3f8000003f800000;
  auVar104._12_4_ = 0x3f800000;
  auVar104._16_4_ = 0x3f800000;
  auVar104._20_4_ = 0x3f800000;
  auVar104._24_4_ = 0x3f800000;
  auVar104._28_4_ = 0x3f800000;
  auVar104 = vfnmadd213ps_avx512vl(auVar106,auVar105,auVar104);
  auVar100 = vfmadd132ps_fma(auVar104,auVar105,auVar105);
  auVar107._0_4_ = auVar109._0_4_ + auVar156._0_4_;
  auVar107._4_4_ = auVar109._4_4_ + auVar156._4_4_;
  auVar107._8_4_ = auVar109._8_4_ + auVar156._8_4_;
  auVar107._12_4_ = auVar109._12_4_ + auVar156._12_4_;
  auVar107._16_4_ = auVar109._16_4_ + auVar156._16_4_;
  auVar107._20_4_ = auVar109._20_4_ + auVar156._20_4_;
  auVar107._24_4_ = auVar109._24_4_ + auVar156._24_4_;
  auVar107._28_4_ = auVar109._28_4_ + auVar156._28_4_;
  auVar114._0_4_ = auVar124._0_4_ + auVar113._0_4_;
  auVar114._4_4_ = auVar124._4_4_ + auVar113._4_4_;
  auVar114._8_4_ = auVar124._8_4_ + auVar113._8_4_;
  auVar114._12_4_ = auVar124._12_4_ + auVar113._12_4_;
  auVar114._16_4_ = auVar124._16_4_ + auVar113._16_4_;
  auVar114._20_4_ = auVar124._20_4_ + auVar113._20_4_;
  auVar114._24_4_ = auVar124._24_4_ + auVar113._24_4_;
  auVar114._28_4_ = auVar124._28_4_ + auVar113._28_4_;
  auVar115._0_4_ = auVar110._0_4_ + auVar158._0_4_;
  auVar115._4_4_ = auVar110._4_4_ + auVar158._4_4_;
  auVar115._8_4_ = auVar110._8_4_ + auVar158._8_4_;
  auVar115._12_4_ = auVar110._12_4_ + auVar158._12_4_;
  auVar115._16_4_ = auVar110._16_4_ + auVar158._16_4_;
  auVar115._20_4_ = auVar110._20_4_ + auVar158._20_4_;
  auVar115._24_4_ = auVar110._24_4_ + auVar158._24_4_;
  auVar115._28_4_ = auVar110._28_4_ + auVar158._28_4_;
  auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar105 = vmulps_avx512vl(auVar107,auVar104);
  auVar106 = vmulps_avx512vl(auVar114,auVar104);
  auVar107 = vmulps_avx512vl(auVar115,auVar104);
  auVar104 = vsubps_avx(auVar105,auVar108);
  auVar105 = vsubps_avx(auVar106,auVar111);
  auVar106 = vsubps_avx(auVar107,auVar112);
  auVar106 = vmulps_avx512vl(auVar106,auVar103);
  auVar105 = vfmadd231ps_avx512vl(auVar106,auVar102,auVar105);
  auVar104 = vfmadd231ps_avx512vl(auVar105,auVar101,auVar104);
  auVar142._0_4_ = auVar104._0_4_ * auVar100._0_4_;
  auVar142._4_4_ = auVar104._4_4_ * auVar100._4_4_;
  auVar142._8_4_ = auVar104._8_4_ * auVar100._8_4_;
  auVar142._12_4_ = auVar104._12_4_ * auVar100._12_4_;
  auVar142._16_4_ = auVar104._16_4_ * 0.0;
  auVar142._20_4_ = auVar104._20_4_ * 0.0;
  auVar142._24_4_ = auVar104._24_4_ * 0.0;
  auVar142._28_4_ = 0;
  auVar104 = vmulps_avx512vl(auVar101,auVar142);
  auVar105 = vmulps_avx512vl(auVar102,auVar142);
  auVar106 = vmulps_avx512vl(auVar103,auVar142);
  auVar118._0_4_ = auVar104._0_4_ + fVar1;
  auVar118._4_4_ = auVar104._4_4_ + fVar1;
  auVar118._8_4_ = auVar104._8_4_ + fVar1;
  auVar118._12_4_ = auVar104._12_4_ + fVar1;
  auVar118._16_4_ = auVar104._16_4_ + fVar1;
  auVar118._20_4_ = auVar104._20_4_ + fVar1;
  auVar118._24_4_ = auVar104._24_4_ + fVar1;
  auVar118._28_4_ = auVar104._28_4_ + fVar1;
  auVar119._0_4_ = auVar105._0_4_ + fVar2;
  auVar119._4_4_ = auVar105._4_4_ + fVar2;
  auVar119._8_4_ = auVar105._8_4_ + fVar2;
  auVar119._12_4_ = auVar105._12_4_ + fVar2;
  auVar119._16_4_ = auVar105._16_4_ + fVar2;
  auVar119._20_4_ = auVar105._20_4_ + fVar2;
  auVar119._24_4_ = auVar105._24_4_ + fVar2;
  auVar119._28_4_ = auVar105._28_4_ + fVar2;
  auVar120._0_4_ = fVar3 + auVar106._0_4_;
  auVar120._4_4_ = fVar3 + auVar106._4_4_;
  auVar120._8_4_ = fVar3 + auVar106._8_4_;
  auVar120._12_4_ = fVar3 + auVar106._12_4_;
  auVar120._16_4_ = fVar3 + auVar106._16_4_;
  auVar120._20_4_ = fVar3 + auVar106._20_4_;
  auVar120._24_4_ = fVar3 + auVar106._24_4_;
  auVar120._28_4_ = fVar3 + auVar106._28_4_;
  auVar106 = vsubps_avx512vl(auVar156,auVar109);
  auVar193 = ZEXT3264(auVar106);
  auVar107 = vsubps_avx512vl(auVar124,auVar113);
  auVar191 = ZEXT3264(auVar107);
  auVar108 = vsubps_avx512vl(auVar158,auVar110);
  auVar192 = ZEXT3264(auVar108);
  _local_600 = vsubps_avx(auVar118,auVar109);
  _local_5c0 = vsubps_avx512vl(auVar119,auVar113);
  auVar109 = vsubps_avx512vl(auVar120,auVar110);
  auVar196 = ZEXT3264(auVar109);
  auVar104 = vmulps_avx512vl(auVar108,auVar108);
  auVar104 = vfmadd231ps_avx512vl(auVar104,auVar107,auVar107);
  auVar110 = vfmadd231ps_avx512vl(auVar104,auVar106,auVar106);
  auVar104 = vmulps_avx512vl(auVar108,auVar109);
  auVar104 = vfmadd231ps_avx512vl(auVar104,_local_5c0,auVar107);
  auVar111 = vfmadd231ps_avx512vl(auVar104,_local_600,auVar106);
  auVar104 = vmulps_avx512vl(auVar108,auVar103);
  auVar104 = vfmadd231ps_avx512vl(auVar104,auVar102,auVar107);
  auVar112 = vfmadd231ps_avx512vl(auVar104,auVar101,auVar106);
  auVar104 = vsubps_avx(auVar131,auVar154);
  fVar1 = auVar104._0_4_;
  fVar3 = auVar104._4_4_;
  fVar56 = auVar104._8_4_;
  fVar59 = auVar104._12_4_;
  fVar62 = auVar104._16_4_;
  fVar65 = auVar104._20_4_;
  fVar68 = auVar104._24_4_;
  auVar146._0_4_ = fVar1 * fVar1 + auVar110._0_4_;
  auVar146._4_4_ = fVar3 * fVar3 + auVar110._4_4_;
  auVar146._8_4_ = fVar56 * fVar56 + auVar110._8_4_;
  auVar146._12_4_ = fVar59 * fVar59 + auVar110._12_4_;
  auVar146._16_4_ = fVar62 * fVar62 + auVar110._16_4_;
  auVar146._20_4_ = fVar65 * fVar65 + auVar110._20_4_;
  auVar146._24_4_ = fVar68 * fVar68 + auVar110._24_4_;
  auVar146._28_4_ = auVar113._28_4_ + auVar110._28_4_;
  auVar105 = vmulps_avx512vl(auVar103,auVar109);
  auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,_local_5c0);
  auVar113 = vfmadd231ps_avx512vl(auVar105,auVar101,_local_600);
  auVar105 = vmulps_avx512vl(auVar109,auVar109);
  auVar105 = vfmadd231ps_avx512vl(auVar105,_local_5c0,_local_5c0);
  auVar114 = vfmadd231ps_avx512vl(auVar105,_local_600,_local_600);
  auVar115 = vmulps_avx512vl(auVar110,auVar110);
  auVar197 = ZEXT3264(auVar115);
  auVar116 = vmulps_avx512vl(auVar131,auVar110);
  fVar2 = auVar112._0_4_;
  fVar167 = fVar2 * fVar2;
  fVar54 = auVar112._4_4_;
  fVar170 = fVar54 * fVar54;
  auVar105._4_4_ = fVar170;
  auVar105._0_4_ = fVar167;
  fVar57 = auVar112._8_4_;
  fVar171 = fVar57 * fVar57;
  auVar105._8_4_ = fVar171;
  fVar60 = auVar112._12_4_;
  fVar172 = fVar60 * fVar60;
  auVar105._12_4_ = fVar172;
  fVar63 = auVar112._16_4_;
  fVar173 = fVar63 * fVar63;
  auVar105._16_4_ = fVar173;
  fVar66 = auVar112._20_4_;
  fVar174 = fVar66 * fVar66;
  auVar105._20_4_ = fVar174;
  fVar69 = auVar112._24_4_;
  fVar175 = fVar69 * fVar69;
  auVar105._24_4_ = fVar175;
  auVar105._28_4_ = local_600._28_4_;
  auVar105 = vmulps_avx512vl(auVar146,auVar105);
  auVar105 = vsubps_avx512vl(auVar115,auVar105);
  auVar113 = vmulps_avx512vl(auVar115,auVar113);
  auVar117 = vmulps_avx512vl(auVar112,auVar111);
  auVar117 = vmulps_avx512vl(auVar146,auVar117);
  auVar113 = vsubps_avx512vl(auVar113,auVar117);
  auVar117 = vmulps_avx512vl(auVar104,auVar112);
  auVar117 = vmulps_avx512vl(auVar116,auVar117);
  auVar113 = vaddps_avx512vl(auVar117,auVar113);
  auVar114 = vmulps_avx512vl(auVar115,auVar114);
  auVar117 = vmulps_avx512vl(auVar111,auVar111);
  auVar117 = vmulps_avx512vl(auVar146,auVar117);
  auVar114 = vsubps_avx512vl(auVar114,auVar117);
  auVar104 = vaddps_avx512vl(auVar104,auVar104);
  auVar104 = vmulps_avx512vl(auVar104,auVar111);
  auVar104 = vsubps_avx512vl(auVar104,auVar116);
  auVar104 = vmulps_avx512vl(auVar116,auVar104);
  auVar104 = vaddps_avx512vl(auVar114,auVar104);
  auVar114 = vmulps_avx512vl(auVar113,auVar113);
  auVar104 = vmulps_avx512vl(auVar105,auVar104);
  auVar104 = vsubps_avx512vl(auVar114,auVar104);
  auVar114 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  uVar98 = vcmpps_avx512vl(auVar104,auVar114,5);
  bVar90 = (byte)(uVar76 & uVar98);
  if (bVar90 != 0) {
    auVar156 = vsubps_avx(auVar118,auVar156);
    auVar124 = vsubps_avx(auVar119,auVar124);
    auVar158 = vsubps_avx(auVar120,auVar158);
    auVar118 = vsqrtps_avx512vl(auVar104);
    auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar104 = vrcp14ps_avx512vl(auVar105);
    auVar120 = vfnmadd213ps_avx512vl(auVar104,auVar105,auVar119);
    auVar116._8_4_ = 0x7fffffff;
    auVar116._0_8_ = 0x7fffffff7fffffff;
    auVar116._12_4_ = 0x7fffffff;
    auVar116._16_4_ = 0x7fffffff;
    auVar116._20_4_ = 0x7fffffff;
    auVar116._24_4_ = 0x7fffffff;
    auVar116._28_4_ = 0x7fffffff;
    vandps_avx512vl(auVar105,auVar116);
    auVar117._8_4_ = 0x219392ef;
    auVar117._0_8_ = 0x219392ef219392ef;
    auVar117._12_4_ = 0x219392ef;
    auVar117._16_4_ = 0x219392ef;
    auVar117._20_4_ = 0x219392ef;
    auVar117._24_4_ = 0x219392ef;
    auVar117._28_4_ = 0x219392ef;
    uVar96 = vcmpps_avx512vl(auVar120,auVar117,2);
    auVar105 = vfmadd132ps_avx512vl(auVar120,auVar104,auVar104);
    auVar155._8_4_ = 0x80000000;
    auVar155._0_8_ = 0x8000000080000000;
    auVar155._12_4_ = 0x80000000;
    auVar155._16_4_ = 0x80000000;
    auVar155._20_4_ = 0x80000000;
    auVar155._24_4_ = 0x80000000;
    auVar155._28_4_ = 0x80000000;
    auVar104 = vxorps_avx512vl(auVar113,auVar155);
    auVar104 = vsubps_avx(auVar104,auVar118);
    auVar104 = vmulps_avx512vl(auVar104,auVar105);
    auVar178._8_4_ = 0xff800000;
    auVar178._0_8_ = 0xff800000ff800000;
    auVar178._12_4_ = 0xff800000;
    auVar178._16_4_ = 0xff800000;
    auVar178._20_4_ = 0xff800000;
    auVar178._24_4_ = 0xff800000;
    auVar178._28_4_ = 0xff800000;
    bVar14 = (bool)((byte)uVar96 & 1);
    auVar121._0_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar104._0_4_;
    bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
    auVar121._4_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar104._4_4_;
    bVar14 = (bool)((byte)(uVar96 >> 2) & 1);
    auVar121._8_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar104._8_4_;
    bVar14 = (bool)((byte)(uVar96 >> 3) & 1);
    auVar121._12_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar104._12_4_;
    bVar14 = (bool)((byte)(uVar96 >> 4) & 1);
    auVar121._16_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar104._16_4_;
    bVar14 = (bool)((byte)(uVar96 >> 5) & 1);
    auVar121._20_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar104._20_4_;
    bVar14 = (bool)((byte)(uVar96 >> 6) & 1);
    auVar121._24_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar104._24_4_;
    bVar14 = SUB81(uVar96 >> 7,0);
    auVar121._28_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar104._28_4_;
    auVar104 = vsubps_avx512vl(auVar118,auVar113);
    auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    auVar187 = ZEXT3264(auVar116);
    auVar104 = vmulps_avx512vl(auVar104,auVar105);
    bVar14 = (bool)((byte)uVar96 & 1);
    iVar99 = auVar116._0_4_;
    auVar122._0_4_ = (uint)bVar14 * iVar99 | (uint)!bVar14 * auVar104._0_4_;
    bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
    iVar135 = auVar116._4_4_;
    auVar122._4_4_ = (uint)bVar14 * iVar135 | (uint)!bVar14 * auVar104._4_4_;
    bVar14 = (bool)((byte)(uVar96 >> 2) & 1);
    iVar136 = auVar116._8_4_;
    auVar122._8_4_ = (uint)bVar14 * iVar136 | (uint)!bVar14 * auVar104._8_4_;
    bVar14 = (bool)((byte)(uVar96 >> 3) & 1);
    iVar137 = auVar116._12_4_;
    auVar122._12_4_ = (uint)bVar14 * iVar137 | (uint)!bVar14 * auVar104._12_4_;
    bVar14 = (bool)((byte)(uVar96 >> 4) & 1);
    iVar138 = auVar116._16_4_;
    auVar122._16_4_ = (uint)bVar14 * iVar138 | (uint)!bVar14 * auVar104._16_4_;
    bVar14 = (bool)((byte)(uVar96 >> 5) & 1);
    iVar139 = auVar116._20_4_;
    auVar122._20_4_ = (uint)bVar14 * iVar139 | (uint)!bVar14 * auVar104._20_4_;
    bVar14 = (bool)((byte)(uVar96 >> 6) & 1);
    iVar140 = auVar116._24_4_;
    iVar141 = auVar116._28_4_;
    auVar122._24_4_ = (uint)bVar14 * iVar140 | (uint)!bVar14 * auVar104._24_4_;
    bVar14 = SUB81(uVar96 >> 7,0);
    auVar122._28_4_ = (uint)bVar14 * iVar141 | (uint)!bVar14 * auVar104._28_4_;
    auVar104 = vmulps_avx512vl(auVar112,auVar121);
    auVar176._0_4_ = auVar111._0_4_ + auVar104._0_4_;
    auVar176._4_4_ = auVar111._4_4_ + auVar104._4_4_;
    auVar176._8_4_ = auVar111._8_4_ + auVar104._8_4_;
    auVar176._12_4_ = auVar111._12_4_ + auVar104._12_4_;
    auVar176._16_4_ = auVar111._16_4_ + auVar104._16_4_;
    auVar176._20_4_ = auVar111._20_4_ + auVar104._20_4_;
    auVar176._24_4_ = auVar111._24_4_ + auVar104._24_4_;
    fVar166 = auVar111._28_4_;
    auVar176._28_4_ = fVar166 + auVar104._28_4_;
    auVar104 = vmulps_avx512vl(auVar112,auVar122);
    auVar117 = vaddps_avx512vl(auVar111,auVar104);
    auVar195 = ZEXT3264(auVar117);
    uVar71 = vcmpps_avx512vl(auVar176,auVar110,1);
    uVar72 = vcmpps_avx512vl(auVar176,auVar114,6);
    uVar73 = vcmpps_avx512vl(auVar117,auVar110,1);
    uVar74 = vcmpps_avx512vl(auVar117,auVar114,6);
    auVar169._0_4_ = fVar2 * (float)local_600._0_4_;
    auVar169._4_4_ = fVar54 * (float)local_600._4_4_;
    auVar169._8_4_ = fVar57 * fStack_5f8;
    auVar169._12_4_ = fVar60 * fStack_5f4;
    auVar169._16_4_ = fVar63 * fStack_5f0;
    auVar169._20_4_ = fVar66 * fStack_5ec;
    auVar169._28_36_ = SUB4836((undefined1  [48])0x0,0xc);
    auVar169._24_4_ = fVar69 * fStack_5e8;
    auVar104 = vmulps_avx512vl(auVar112,_local_5c0);
    auVar105 = vmulps_avx512vl(auVar112,auVar109);
    auVar113 = vmulps_avx512vl(auVar101,auVar111);
    auVar113 = vsubps_avx512vl(auVar169._0_32_,auVar113);
    auVar114 = vmulps_avx512vl(auVar102,auVar111);
    auVar104 = vsubps_avx512vl(auVar104,auVar114);
    auVar114 = vmulps_avx512vl(auVar103,auVar111);
    auVar105 = vsubps_avx512vl(auVar105,auVar114);
    auVar105 = vmulps_avx512vl(auVar105,auVar105);
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar104);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar113,auVar113);
    fVar53 = auVar131._0_4_;
    fVar55 = auVar131._4_4_;
    fVar58 = auVar131._8_4_;
    fVar61 = auVar131._12_4_;
    fVar64 = auVar131._16_4_;
    fVar67 = auVar131._20_4_;
    fVar70 = auVar131._24_4_;
    auVar82._4_4_ = fVar55 * fVar55 * fVar170;
    auVar82._0_4_ = fVar53 * fVar53 * fVar167;
    auVar82._8_4_ = fVar58 * fVar58 * fVar171;
    auVar82._12_4_ = fVar61 * fVar61 * fVar172;
    auVar82._16_4_ = fVar64 * fVar64 * fVar173;
    auVar82._20_4_ = fVar67 * fVar67 * fVar174;
    auVar82._24_4_ = fVar70 * fVar70 * fVar175;
    auVar82._28_4_ = auVar113._28_4_;
    uVar96 = vcmpps_avx512vl(auVar104,auVar82,1);
    uVar96 = (bVar90 & ~(byte)line->leftExists) & uVar96;
    auVar104 = vrcp14ps_avx512vl(auVar112);
    auVar105 = vfnmadd213ps_avx512vl(auVar104,auVar112,auVar119);
    auVar114 = vfmadd132ps_avx512vl(auVar105,auVar104,auVar104);
    auVar160._0_8_ = auVar111._0_8_ ^ 0x8000000080000000;
    auVar160._8_4_ = -auVar111._8_4_;
    auVar160._12_4_ = -auVar111._12_4_;
    auVar160._16_4_ = -auVar111._16_4_;
    auVar160._20_4_ = -auVar111._20_4_;
    auVar160._24_4_ = -auVar111._24_4_;
    auVar160._28_4_ = -fVar166;
    auVar104 = vmulps_avx512vl(auVar114,auVar160);
    bVar14 = (bool)((byte)uVar96 & 1);
    auVar123._0_4_ = (uint)bVar14 * auVar104._0_4_ | (uint)!bVar14 * iVar99;
    bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
    auVar123._4_4_ = (uint)bVar14 * auVar104._4_4_ | (uint)!bVar14 * iVar135;
    bVar14 = (bool)((byte)(uVar96 >> 2) & 1);
    auVar123._8_4_ = (uint)bVar14 * auVar104._8_4_ | (uint)!bVar14 * iVar136;
    bVar14 = (bool)((byte)(uVar96 >> 3) & 1);
    auVar123._12_4_ = (uint)bVar14 * auVar104._12_4_ | (uint)!bVar14 * iVar137;
    bVar14 = (bool)((byte)(uVar96 >> 4) & 1);
    auVar123._16_4_ = (uint)bVar14 * auVar104._16_4_ | (uint)!bVar14 * iVar138;
    bVar14 = (bool)((byte)(uVar96 >> 5) & 1);
    auVar123._20_4_ = (uint)bVar14 * auVar104._20_4_ | (uint)!bVar14 * iVar139;
    bVar14 = (bool)((byte)(uVar96 >> 6) & 1);
    auVar123._24_4_ = (uint)bVar14 * auVar104._24_4_ | (uint)!bVar14 * iVar140;
    bVar14 = SUB81(uVar96 >> 7,0);
    auVar123._28_4_ = (uint)bVar14 * auVar104._28_4_ | (uint)!bVar14 * iVar141;
    auVar186 = ZEXT3264(auVar123);
    auVar104 = vmulps_avx512vl(auVar108,auVar158);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar124,auVar107);
    auVar111 = vfmadd231ps_avx512vl(auVar104,auVar156,auVar106);
    auVar83._4_4_ = auVar156._4_4_ * fVar54;
    auVar83._0_4_ = auVar156._0_4_ * fVar2;
    auVar83._8_4_ = auVar156._8_4_ * fVar57;
    auVar83._12_4_ = auVar156._12_4_ * fVar60;
    auVar83._16_4_ = auVar156._16_4_ * fVar63;
    auVar83._20_4_ = auVar156._20_4_ * fVar66;
    auVar83._24_4_ = auVar156._24_4_ * fVar69;
    auVar83._28_4_ = fVar166;
    auVar84._4_4_ = auVar124._4_4_ * fVar54;
    auVar84._0_4_ = auVar124._0_4_ * fVar2;
    auVar84._8_4_ = auVar124._8_4_ * fVar57;
    auVar84._12_4_ = auVar124._12_4_ * fVar60;
    auVar84._16_4_ = auVar124._16_4_ * fVar63;
    auVar84._20_4_ = auVar124._20_4_ * fVar66;
    auVar84._24_4_ = auVar124._24_4_ * fVar69;
    auVar84._28_4_ = auVar156._28_4_;
    auVar85._4_4_ = auVar158._4_4_ * fVar54;
    auVar85._0_4_ = auVar158._0_4_ * fVar2;
    auVar85._8_4_ = auVar158._8_4_ * fVar57;
    auVar85._12_4_ = auVar158._12_4_ * fVar60;
    auVar85._16_4_ = auVar158._16_4_ * fVar63;
    auVar85._20_4_ = auVar158._20_4_ * fVar66;
    auVar85._24_4_ = auVar158._24_4_ * fVar69;
    auVar85._28_4_ = auVar112._28_4_;
    auVar104 = vmulps_avx512vl(auVar101,auVar111);
    auVar104 = vsubps_avx(auVar83,auVar104);
    auVar105 = vmulps_avx512vl(auVar102,auVar111);
    auVar105 = vsubps_avx(auVar84,auVar105);
    auVar124 = vmulps_avx512vl(auVar103,auVar111);
    auVar113 = vsubps_avx(auVar85,auVar124);
    auVar86._4_4_ = auVar113._4_4_ * auVar113._4_4_;
    auVar86._0_4_ = auVar113._0_4_ * auVar113._0_4_;
    auVar86._8_4_ = auVar113._8_4_ * auVar113._8_4_;
    auVar86._12_4_ = auVar113._12_4_ * auVar113._12_4_;
    auVar86._16_4_ = auVar113._16_4_ * auVar113._16_4_;
    auVar86._20_4_ = auVar113._20_4_ * auVar113._20_4_;
    auVar86._24_4_ = auVar113._24_4_ * auVar113._24_4_;
    auVar86._28_4_ = auVar113._28_4_;
    auVar100 = vfmadd231ps_fma(auVar86,auVar105,auVar105);
    auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar104,auVar104);
    auVar87._4_4_ = fVar170 * auVar154._4_4_ * auVar154._4_4_;
    auVar87._0_4_ = fVar167 * auVar154._0_4_ * auVar154._0_4_;
    auVar87._8_4_ = fVar171 * auVar154._8_4_ * auVar154._8_4_;
    auVar87._12_4_ = fVar172 * auVar154._12_4_ * auVar154._12_4_;
    auVar87._16_4_ = fVar173 * auVar154._16_4_ * auVar154._16_4_;
    auVar87._20_4_ = fVar174 * auVar154._20_4_ * auVar154._20_4_;
    auVar87._24_4_ = fVar175 * auVar154._24_4_ * auVar154._24_4_;
    auVar87._28_4_ = auVar154._28_4_;
    uVar4 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar164._4_4_ = uVar4;
    auVar164._0_4_ = uVar4;
    auVar164._8_4_ = uVar4;
    auVar164._12_4_ = uVar4;
    auVar164._16_4_ = uVar4;
    auVar164._20_4_ = uVar4;
    auVar164._24_4_ = uVar4;
    auVar164._28_4_ = uVar4;
    bVar89 = (byte)uVar71 & (byte)uVar72 & bVar90;
    auVar104 = vblendmps_avx512vl(auVar116,auVar121);
    auVar125._0_4_ =
         (uint)(bVar89 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar89 & 1) * auVar105._0_4_;
    bVar14 = (bool)(bVar89 >> 1 & 1);
    auVar125._4_4_ = (uint)bVar14 * auVar104._4_4_ | (uint)!bVar14 * auVar105._4_4_;
    bVar14 = (bool)(bVar89 >> 2 & 1);
    auVar125._8_4_ = (uint)bVar14 * auVar104._8_4_ | (uint)!bVar14 * auVar105._8_4_;
    bVar14 = (bool)(bVar89 >> 3 & 1);
    auVar125._12_4_ = (uint)bVar14 * auVar104._12_4_ | (uint)!bVar14 * auVar105._12_4_;
    bVar14 = (bool)(bVar89 >> 4 & 1);
    auVar125._16_4_ = (uint)bVar14 * auVar104._16_4_ | (uint)!bVar14 * auVar105._16_4_;
    bVar14 = (bool)(bVar89 >> 5 & 1);
    auVar125._20_4_ = (uint)bVar14 * auVar104._20_4_ | (uint)!bVar14 * auVar105._20_4_;
    bVar14 = (bool)(bVar89 >> 6 & 1);
    auVar125._24_4_ = (uint)bVar14 * auVar104._24_4_ | (uint)!bVar14 * auVar105._24_4_;
    auVar125._28_4_ =
         (uint)(bVar89 >> 7) * auVar104._28_4_ | (uint)!(bool)(bVar89 >> 7) * auVar105._28_4_;
    auVar180 = ZEXT3264(auVar125);
    bVar89 = (byte)uVar73 & (byte)uVar74 & bVar90;
    auVar104 = vblendmps_avx512vl(auVar178,auVar122);
    auVar126._0_4_ =
         (uint)(bVar89 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar89 & 1) * auVar124._0_4_;
    bVar14 = (bool)(bVar89 >> 1 & 1);
    auVar126._4_4_ = (uint)bVar14 * auVar104._4_4_ | (uint)!bVar14 * auVar124._4_4_;
    bVar14 = (bool)(bVar89 >> 2 & 1);
    auVar126._8_4_ = (uint)bVar14 * auVar104._8_4_ | (uint)!bVar14 * auVar124._8_4_;
    bVar14 = (bool)(bVar89 >> 3 & 1);
    auVar126._12_4_ = (uint)bVar14 * auVar104._12_4_ | (uint)!bVar14 * auVar124._12_4_;
    bVar14 = (bool)(bVar89 >> 4 & 1);
    auVar126._16_4_ = (uint)bVar14 * auVar104._16_4_ | (uint)!bVar14 * auVar124._16_4_;
    bVar14 = (bool)(bVar89 >> 5 & 1);
    auVar126._20_4_ = (uint)bVar14 * auVar104._20_4_ | (uint)!bVar14 * auVar124._20_4_;
    bVar14 = (bool)(bVar89 >> 6 & 1);
    auVar126._24_4_ = (uint)bVar14 * auVar104._24_4_ | (uint)!bVar14 * auVar124._24_4_;
    auVar126._28_4_ =
         (uint)(bVar89 >> 7) * auVar104._28_4_ | (uint)!(bool)(bVar89 >> 7) * auVar124._28_4_;
    auVar181 = ZEXT3264(auVar126);
    auVar161._0_8_ = auVar111._0_8_ ^ 0x8000000080000000;
    auVar161._8_4_ = auVar111._8_4_ ^ 0x80000000;
    auVar161._12_4_ = auVar111._12_4_ ^ 0x80000000;
    auVar161._16_4_ = auVar111._16_4_ ^ 0x80000000;
    auVar161._20_4_ = auVar111._20_4_ ^ 0x80000000;
    auVar161._24_4_ = auVar111._24_4_ ^ 0x80000000;
    auVar161._28_4_ = auVar111._28_4_ ^ 0x80000000;
    uVar96 = vcmpps_avx512vl(ZEXT1632(auVar100),auVar87,1);
    uVar96 = (bVar90 & ~(byte)line->rightExists) & uVar96;
    auVar104 = vmulps_avx512vl(auVar114,auVar161);
    bVar14 = (bool)((byte)uVar96 & 1);
    auVar127._0_4_ = (uint)bVar14 * auVar104._0_4_ | (uint)!bVar14 * iVar99;
    bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
    auVar127._4_4_ = (uint)bVar14 * auVar104._4_4_ | (uint)!bVar14 * iVar135;
    bVar14 = (bool)((byte)(uVar96 >> 2) & 1);
    auVar127._8_4_ = (uint)bVar14 * auVar104._8_4_ | (uint)!bVar14 * iVar136;
    bVar14 = (bool)((byte)(uVar96 >> 3) & 1);
    auVar127._12_4_ = (uint)bVar14 * auVar104._12_4_ | (uint)!bVar14 * iVar137;
    bVar14 = (bool)((byte)(uVar96 >> 4) & 1);
    auVar127._16_4_ = (uint)bVar14 * auVar104._16_4_ | (uint)!bVar14 * iVar138;
    bVar14 = (bool)((byte)(uVar96 >> 5) & 1);
    auVar127._20_4_ = (uint)bVar14 * auVar104._20_4_ | (uint)!bVar14 * iVar139;
    bVar14 = (bool)((byte)(uVar96 >> 6) & 1);
    auVar127._24_4_ = (uint)bVar14 * auVar104._24_4_ | (uint)!bVar14 * iVar140;
    bVar14 = SUB81(uVar96 >> 7,0);
    auVar127._28_4_ = (uint)bVar14 * auVar104._28_4_ | (uint)!bVar14 * iVar141;
    auVar104 = vminps_avx512vl(auVar123,auVar127);
    auVar113 = vmaxps_avx512vl(auVar123,auVar127);
    auVar105 = vminps_avx(auVar125,auVar104);
    uVar96 = vcmpps_avx512vl(auVar105,auVar104,0);
    uVar75 = vcmpps_avx512vl(auVar113,auVar116,0);
    bVar14 = (bool)((byte)uVar75 & 1);
    bVar17 = (bool)((byte)(uVar75 >> 1) & 1);
    bVar19 = (bool)((byte)(uVar75 >> 2) & 1);
    bVar21 = (bool)((byte)(uVar75 >> 3) & 1);
    bVar23 = (bool)((byte)(uVar75 >> 4) & 1);
    bVar30 = (bool)((byte)(uVar75 >> 5) & 1);
    bVar38 = (bool)((byte)(uVar75 >> 6) & 1);
    bVar47 = SUB81(uVar75 >> 7,0);
    uVar75 = vcmpps_avx512vl(auVar104,auVar116,0);
    bVar15 = (bool)((byte)uVar75 & 1);
    bVar18 = (bool)((byte)(uVar75 >> 1) & 1);
    bVar20 = (bool)((byte)(uVar75 >> 2) & 1);
    bVar22 = (bool)((byte)(uVar75 >> 3) & 1);
    bVar24 = (bool)((byte)(uVar75 >> 4) & 1);
    bVar31 = (bool)((byte)(uVar75 >> 5) & 1);
    bVar39 = (bool)((byte)(uVar75 >> 6) & 1);
    bVar48 = SUB81(uVar75 >> 7,0);
    bVar16 = (bool)((byte)uVar96 & 1);
    auVar128._0_4_ =
         (uint)bVar16 * ((uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar113._0_4_) |
         (uint)!bVar16 * ((uint)bVar15 * -0x800000 | (uint)!bVar15 * auVar104._0_4_);
    bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
    auVar128._4_4_ =
         (uint)bVar14 * ((uint)bVar17 * -0x800000 | (uint)!bVar17 * auVar113._4_4_) |
         (uint)!bVar14 * ((uint)bVar18 * -0x800000 | (uint)!bVar18 * auVar104._4_4_);
    bVar14 = (bool)((byte)(uVar96 >> 2) & 1);
    auVar128._8_4_ =
         (uint)bVar14 * ((uint)bVar19 * -0x800000 | (uint)!bVar19 * auVar113._8_4_) |
         (uint)!bVar14 * ((uint)bVar20 * -0x800000 | (uint)!bVar20 * auVar104._8_4_);
    bVar14 = (bool)((byte)(uVar96 >> 3) & 1);
    auVar128._12_4_ =
         (uint)bVar14 * ((uint)bVar21 * -0x800000 | (uint)!bVar21 * auVar113._12_4_) |
         (uint)!bVar14 * ((uint)bVar22 * -0x800000 | (uint)!bVar22 * auVar104._12_4_);
    bVar14 = (bool)((byte)(uVar96 >> 4) & 1);
    auVar128._16_4_ =
         (uint)bVar14 * ((uint)bVar23 * -0x800000 | (uint)!bVar23 * auVar113._16_4_) |
         (uint)!bVar14 * ((uint)bVar24 * -0x800000 | (uint)!bVar24 * auVar104._16_4_);
    bVar14 = (bool)((byte)(uVar96 >> 5) & 1);
    auVar128._20_4_ =
         (uint)bVar14 * ((uint)bVar30 * -0x800000 | (uint)!bVar30 * auVar113._20_4_) |
         (uint)!bVar14 * ((uint)bVar31 * -0x800000 | (uint)!bVar31 * auVar104._20_4_);
    bVar14 = (bool)((byte)(uVar96 >> 6) & 1);
    auVar128._24_4_ =
         (uint)bVar14 * ((uint)bVar38 * -0x800000 | (uint)!bVar38 * auVar113._24_4_) |
         (uint)!bVar14 * ((uint)bVar39 * -0x800000 | (uint)!bVar39 * auVar104._24_4_);
    bVar14 = SUB81(uVar96 >> 7,0);
    auVar128._28_4_ =
         (uint)bVar14 * ((uint)bVar47 * -0x800000 | (uint)!bVar47 * auVar113._28_4_) |
         (uint)!bVar14 * ((uint)bVar48 * -0x800000 | (uint)!bVar48 * auVar104._28_4_);
    auVar104 = vmaxps_avx(auVar126,auVar128);
    auVar182 = ZEXT3264(auVar104);
    auVar159._0_4_ = auVar142._0_4_ + auVar105._0_4_;
    auVar159._4_4_ = auVar142._4_4_ + auVar105._4_4_;
    auVar159._8_4_ = auVar142._8_4_ + auVar105._8_4_;
    auVar159._12_4_ = auVar142._12_4_ + auVar105._12_4_;
    auVar159._16_4_ = auVar142._16_4_ + auVar105._16_4_;
    auVar159._20_4_ = auVar142._20_4_ + auVar105._20_4_;
    auVar159._24_4_ = auVar142._24_4_ + auVar105._24_4_;
    auVar159._28_4_ = auVar105._28_4_ + 0.0;
    uVar96 = vcmpps_avx512vl(auVar164,auVar159,2);
    uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar162._4_4_ = uVar4;
    auVar162._0_4_ = uVar4;
    auVar162._8_4_ = uVar4;
    auVar162._12_4_ = uVar4;
    auVar162._16_4_ = uVar4;
    auVar162._20_4_ = uVar4;
    auVar162._24_4_ = uVar4;
    auVar162._28_4_ = uVar4;
    uVar75 = vcmpps_avx512vl(auVar159,auVar162,2);
    auVar168._0_4_ = auVar104._0_4_ + auVar142._0_4_;
    auVar168._4_4_ = auVar104._4_4_ + auVar142._4_4_;
    auVar168._8_4_ = auVar104._8_4_ + auVar142._8_4_;
    auVar168._12_4_ = auVar104._12_4_ + auVar142._12_4_;
    auVar168._16_4_ = auVar104._16_4_ + auVar142._16_4_;
    auVar168._20_4_ = auVar104._20_4_ + auVar142._20_4_;
    auVar168._24_4_ = auVar104._24_4_ + auVar142._24_4_;
    auVar168._28_4_ = auVar104._28_4_ + 0.0;
    auVar169 = ZEXT3264(auVar168);
    uVar71 = vcmpps_avx512vl(auVar164,auVar168,2);
    uVar72 = vcmpps_avx512vl(auVar168,auVar162,2);
    uVar73 = vcmpps_avx512vl(auVar104,auVar178,4);
    bVar94 = (byte)uVar71 & (byte)uVar72 & (byte)uVar73;
    uVar97 = vcmpps_avx512vl(auVar105,auVar116,4);
    uVar97 = uVar96 & uVar75 & uVar97;
    bVar89 = (byte)uVar97 & bVar90;
    bVar78 = bVar90 & ((byte)uVar97 | bVar94);
    uVar95 = (uint)bVar78;
    if (bVar78 != 0) {
      auVar104 = vblendmps_avx512vl(auVar104,auVar105);
      auVar129._0_4_ =
           (float)((uint)(bVar89 & 1) * auVar104._0_4_ |
                  (uint)!(bool)(bVar89 & 1) * (int)auVar159._0_4_);
      bVar14 = (bool)(bVar89 >> 1 & 1);
      auVar129._4_4_ = (float)((uint)bVar14 * auVar104._4_4_ | (uint)!bVar14 * (int)auVar159._4_4_);
      bVar14 = (bool)(bVar89 >> 2 & 1);
      auVar129._8_4_ = (float)((uint)bVar14 * auVar104._8_4_ | (uint)!bVar14 * (int)auVar159._8_4_);
      bVar14 = (bool)(bVar89 >> 3 & 1);
      auVar129._12_4_ =
           (float)((uint)bVar14 * auVar104._12_4_ | (uint)!bVar14 * (int)auVar159._12_4_);
      bVar14 = (bool)(bVar89 >> 4 & 1);
      auVar129._16_4_ =
           (float)((uint)bVar14 * auVar104._16_4_ | (uint)!bVar14 * (int)auVar159._16_4_);
      bVar14 = (bool)(bVar89 >> 5 & 1);
      auVar129._20_4_ =
           (float)((uint)bVar14 * auVar104._20_4_ | (uint)!bVar14 * (int)auVar159._20_4_);
      bVar14 = (bool)(bVar89 >> 6 & 1);
      auVar129._24_4_ =
           (float)((uint)bVar14 * auVar104._24_4_ | (uint)!bVar14 * (int)auVar159._24_4_);
      auVar129._28_4_ =
           (float)((uint)(bVar89 >> 7) * auVar104._28_4_ |
                  (uint)!(bool)(bVar89 >> 7) * (int)auVar159._28_4_);
      auVar104 = vblendmps_avx512vl(auVar117,auVar176);
      auVar130._0_4_ =
           (float)((uint)(bVar89 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar89 & 1) * -0x800000);
      bVar14 = (bool)(bVar89 >> 1 & 1);
      auVar130._4_4_ = (float)((uint)bVar14 * auVar104._4_4_ | (uint)!bVar14 * -0x800000);
      bVar14 = (bool)(bVar89 >> 2 & 1);
      auVar130._8_4_ = (float)((uint)bVar14 * auVar104._8_4_ | (uint)!bVar14 * -0x800000);
      bVar14 = (bool)(bVar89 >> 3 & 1);
      auVar130._12_4_ = (float)((uint)bVar14 * auVar104._12_4_ | (uint)!bVar14 * -0x800000);
      bVar14 = (bool)(bVar89 >> 4 & 1);
      auVar130._16_4_ = (float)((uint)bVar14 * auVar104._16_4_ | (uint)!bVar14 * -0x800000);
      bVar14 = (bool)(bVar89 >> 5 & 1);
      auVar130._20_4_ = (float)((uint)bVar14 * auVar104._20_4_ | (uint)!bVar14 * -0x800000);
      bVar14 = (bool)(bVar89 >> 6 & 1);
      auVar130._24_4_ = (float)((uint)bVar14 * auVar104._24_4_ | (uint)!bVar14 * -0x800000);
      auVar130._28_4_ =
           (uint)(bVar89 >> 7) * auVar104._28_4_ | (uint)!(bool)(bVar89 >> 7) * -0x800000;
      auVar104 = vrcp14ps_avx512vl(auVar110);
      auVar105 = vfnmadd213ps_avx512vl(auVar104,auVar110,auVar119);
      auVar100 = vfmadd132ps_fma(auVar105,auVar104,auVar104);
      auVar177 = ZEXT1664(auVar100);
      auVar88._4_4_ = fVar55 * fVar3 * auVar110._4_4_;
      auVar88._0_4_ = fVar53 * fVar1 * auVar110._0_4_;
      auVar88._8_4_ = fVar58 * fVar56 * auVar110._8_4_;
      auVar88._12_4_ = fVar61 * fVar59 * auVar110._12_4_;
      auVar88._16_4_ = fVar64 * fVar62 * auVar110._16_4_;
      auVar88._20_4_ = fVar67 * fVar65 * auVar110._20_4_;
      auVar88._24_4_ = fVar70 * fVar68 * auVar110._24_4_;
      auVar88._28_4_ = auVar131._28_4_;
      _local_80 = vmulps_avx512vl(auVar106,auVar88);
      auVar105 = vmulps_avx512vl(auVar107,auVar88);
      auVar183 = ZEXT3264(auVar105);
      auVar113 = vmulps_avx512vl(auVar106,auVar146);
      auVar184 = ZEXT3264(auVar113);
      auVar131 = vmulps_avx512vl(auVar107,auVar146);
      auVar185 = ZEXT3264(auVar131);
      uVar71 = vcmpps_avx512vl(auVar129,auVar125,0);
      uVar72 = vcmpps_avx512vl(auVar129,auVar126,0);
      bVar77 = ((byte)uVar71 | (byte)uVar72) & bVar90;
      uVar96 = vcmpps_avx512vl(auVar129,auVar123,0);
      uVar96 = uVar76 & uVar98 & uVar96;
      auVar110 = vmulps_avx512vl(auVar101,auVar129);
      auVar148._0_4_ = auVar110._0_4_ + (float)local_600._0_4_;
      auVar148._4_4_ = auVar110._4_4_ + (float)local_600._4_4_;
      auVar148._8_4_ = auVar110._8_4_ + fStack_5f8;
      auVar148._12_4_ = auVar110._12_4_ + fStack_5f4;
      auVar148._16_4_ = auVar110._16_4_ + fStack_5f0;
      auVar148._20_4_ = auVar110._20_4_ + fStack_5ec;
      auVar148._24_4_ = auVar110._24_4_ + fStack_5e8;
      auVar148._28_4_ = auVar110._28_4_ + local_600._28_4_;
      auVar110 = vmulps_avx512vl(auVar115,auVar148);
      auVar149._0_4_ = local_80._0_4_ + auVar110._0_4_;
      auVar149._4_4_ = local_80._4_4_ + auVar110._4_4_;
      auVar149._8_4_ = local_80._8_4_ + auVar110._8_4_;
      auVar149._12_4_ = local_80._12_4_ + auVar110._12_4_;
      auVar149._16_4_ = local_80._16_4_ + auVar110._16_4_;
      auVar149._20_4_ = local_80._20_4_ + auVar110._20_4_;
      auVar149._24_4_ = local_80._24_4_ + auVar110._24_4_;
      auVar149._28_4_ = local_80._28_4_ + auVar110._28_4_;
      auVar113 = vmulps_avx512vl(auVar113,auVar130);
      auVar110 = vxorps_avx512vl(auVar106,auVar155);
      auVar194 = ZEXT3264(auVar110);
      auVar106 = vblendmps_avx512vl(auVar106,auVar110);
      bVar89 = (byte)uVar96;
      bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
      bVar17 = (bool)((byte)(uVar96 >> 2) & 1);
      bVar20 = (bool)((byte)(uVar96 >> 3) & 1);
      bVar23 = (bool)((byte)(uVar96 >> 4) & 1);
      bVar31 = (bool)((byte)(uVar96 >> 5) & 1);
      bVar47 = (bool)((byte)(uVar96 >> 6) & 1);
      bVar49 = SUB81(uVar96 >> 7,0);
      auVar113 = vsubps_avx512vl(auVar149,auVar113);
      bVar15 = (bool)(bVar77 >> 1 & 1);
      bVar18 = (bool)(bVar77 >> 2 & 1);
      bVar21 = (bool)(bVar77 >> 3 & 1);
      bVar24 = (bool)(bVar77 >> 4 & 1);
      bVar38 = (bool)(bVar77 >> 5 & 1);
      bVar48 = (bool)(bVar77 >> 6 & 1);
      auVar110 = vmulps_avx512vl(auVar102,auVar129);
      auVar150._0_4_ = auVar110._0_4_ + (float)local_5c0._0_4_;
      auVar150._4_4_ = auVar110._4_4_ + (float)local_5c0._4_4_;
      auVar150._8_4_ = auVar110._8_4_ + fStack_5b8;
      auVar150._12_4_ = auVar110._12_4_ + fStack_5b4;
      auVar150._16_4_ = auVar110._16_4_ + fStack_5b0;
      auVar150._20_4_ = auVar110._20_4_ + fStack_5ac;
      auVar150._24_4_ = auVar110._24_4_ + fStack_5a8;
      auVar150._28_4_ = auVar110._28_4_ + fStack_5a4;
      auVar110 = vmulps_avx512vl(auVar115,auVar150);
      auVar105 = vaddps_avx512vl(auVar105,auVar110);
      iVar135 = (uint)!(bool)(bVar89 & 1) * auVar119._0_4_;
      iVar99 = (uint)!(bool)((byte)(uVar96 >> 1) & 1) * auVar119._4_4_;
      iVar136 = (uint)!(bool)((byte)(uVar96 >> 2) & 1) * auVar119._8_4_;
      iVar137 = (uint)!(bool)((byte)(uVar96 >> 3) & 1) * auVar119._12_4_;
      iVar138 = (uint)!(bool)((byte)(uVar96 >> 4) & 1) * auVar119._16_4_;
      iVar139 = (uint)!(bool)((byte)(uVar96 >> 5) & 1) * auVar119._20_4_;
      iVar140 = (uint)!(bool)((byte)(uVar96 >> 6) & 1) * auVar119._24_4_;
      iVar141 = (uint)!SUB81(uVar96 >> 7,0) * auVar119._28_4_;
      auVar110 = vmulps_avx512vl(auVar130,ZEXT1632(auVar100));
      bVar16 = (bool)(bVar77 >> 1 & 1);
      bVar19 = (bool)(bVar77 >> 2 & 1);
      bVar22 = (bool)(bVar77 >> 3 & 1);
      bVar30 = (bool)(bVar77 >> 4 & 1);
      bVar39 = (bool)(bVar77 >> 5 & 1);
      bVar40 = (bool)(bVar77 >> 6 & 1);
      local_5a0[0] = (uint)(bVar77 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar77 & 1) * iVar135;
      local_5a0[1] = (uint)bVar16 * auVar110._4_4_ | (uint)!bVar16 * iVar99;
      local_5a0[2] = (uint)bVar19 * auVar110._8_4_ | (uint)!bVar19 * iVar136;
      local_5a0[3] = (uint)bVar22 * auVar110._12_4_ | (uint)!bVar22 * iVar137;
      uStack_590 = (uint)bVar30 * auVar110._16_4_ | (uint)!bVar30 * iVar138;
      uStack_58c = (uint)bVar39 * auVar110._20_4_ | (uint)!bVar39 * iVar139;
      uStack_588 = (uint)bVar40 * auVar110._24_4_ | (uint)!bVar40 * iVar140;
      uStack_584 = (uint)(bVar77 >> 7) * auVar110._28_4_ | (uint)!(bool)(bVar77 >> 7) * iVar141;
      auVar131 = vmulps_avx512vl(auVar131,auVar130);
      local_580 = ZEXT432(0) << 0x20;
      auVar110 = vxorps_avx512vl(auVar107,auVar155);
      auVar165 = ZEXT3264(auVar110);
      local_560._0_4_ = auVar142._0_4_ + auVar129._0_4_;
      local_560._4_4_ = auVar142._4_4_ + auVar129._4_4_;
      local_560._8_4_ = auVar142._8_4_ + auVar129._8_4_;
      local_560._12_4_ = auVar142._12_4_ + auVar129._12_4_;
      local_560._16_4_ = auVar142._16_4_ + auVar129._16_4_;
      local_560._20_4_ = auVar142._20_4_ + auVar129._20_4_;
      local_560._24_4_ = auVar142._24_4_ + auVar129._24_4_;
      local_560._28_4_ = auVar129._28_4_ + 0.0;
      auVar153 = ZEXT3264(local_560);
      local_540[0] = (uint)(bVar77 & 1) * auVar113._0_4_ |
                     (uint)!(bool)(bVar77 & 1) *
                     ((uint)(bVar89 & 1) * auVar106._0_4_ |
                     (uint)!(bool)(bVar89 & 1) * auVar104._0_4_);
      local_540[1] = (uint)bVar15 * auVar113._4_4_ |
                     (uint)!bVar15 *
                     ((uint)bVar14 * auVar106._4_4_ | (uint)!bVar14 * auVar104._4_4_);
      local_540[2] = (uint)bVar18 * auVar113._8_4_ |
                     (uint)!bVar18 *
                     ((uint)bVar17 * auVar106._8_4_ | (uint)!bVar17 * auVar104._8_4_);
      local_540[3] = (uint)bVar21 * auVar113._12_4_ |
                     (uint)!bVar21 *
                     ((uint)bVar20 * auVar106._12_4_ | (uint)!bVar20 * auVar104._12_4_);
      uStack_530 = (uint)bVar24 * auVar113._16_4_ |
                   (uint)!bVar24 *
                   ((uint)bVar23 * auVar106._16_4_ | (uint)!bVar23 * auVar104._16_4_);
      uStack_52c = (uint)bVar38 * auVar113._20_4_ |
                   (uint)!bVar38 *
                   ((uint)bVar31 * auVar106._20_4_ | (uint)!bVar31 * auVar104._20_4_);
      uStack_528 = (uint)bVar48 * auVar113._24_4_ |
                   (uint)!bVar48 *
                   ((uint)bVar47 * auVar106._24_4_ | (uint)!bVar47 * auVar104._24_4_);
      uStack_524 = (uint)(bVar77 >> 7) * auVar113._28_4_ |
                   (uint)!(bool)(bVar77 >> 7) *
                   ((uint)bVar49 * auVar106._28_4_ | (uint)!bVar49 * auVar104._28_4_);
      auVar104 = vblendmps_avx512vl(auVar107,auVar110);
      bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
      bVar16 = (bool)((byte)(uVar96 >> 2) & 1);
      bVar17 = (bool)((byte)(uVar96 >> 3) & 1);
      bVar18 = (bool)((byte)(uVar96 >> 4) & 1);
      bVar19 = (bool)((byte)(uVar96 >> 5) & 1);
      bVar20 = (bool)((byte)(uVar96 >> 6) & 1);
      auVar105 = vsubps_avx512vl(auVar105,auVar131);
      local_520[0] = (uint)(bVar77 & 1) * auVar105._0_4_ |
                     (uint)!(bool)(bVar77 & 1) *
                     ((uint)(bVar89 & 1) * auVar104._0_4_ |
                     (uint)!(bool)(bVar89 & 1) * (int)auVar142._0_4_);
      bVar15 = (bool)(bVar77 >> 1 & 1);
      local_520[1] = (uint)bVar15 * auVar105._4_4_ |
                     (uint)!bVar15 *
                     ((uint)bVar14 * auVar104._4_4_ | (uint)!bVar14 * (int)auVar142._4_4_);
      bVar14 = (bool)(bVar77 >> 2 & 1);
      local_520[2] = (uint)bVar14 * auVar105._8_4_ |
                     (uint)!bVar14 *
                     ((uint)bVar16 * auVar104._8_4_ | (uint)!bVar16 * (int)auVar142._8_4_);
      bVar14 = (bool)(bVar77 >> 3 & 1);
      local_520[3] = (uint)bVar14 * auVar105._12_4_ |
                     (uint)!bVar14 *
                     ((uint)bVar17 * auVar104._12_4_ | (uint)!bVar17 * (int)auVar142._12_4_);
      bVar14 = (bool)(bVar77 >> 4 & 1);
      uStack_510 = (uint)bVar14 * auVar105._16_4_ |
                   (uint)!bVar14 *
                   ((uint)bVar18 * auVar104._16_4_ | (uint)!bVar18 * (int)auVar142._16_4_);
      bVar14 = (bool)(bVar77 >> 5 & 1);
      uStack_50c = (uint)bVar14 * auVar105._20_4_ |
                   (uint)!bVar14 *
                   ((uint)bVar19 * auVar104._20_4_ | (uint)!bVar19 * (int)auVar142._20_4_);
      bVar14 = (bool)(bVar77 >> 6 & 1);
      uStack_508 = (uint)bVar14 * auVar105._24_4_ |
                   (uint)!bVar14 *
                   ((uint)bVar20 * auVar104._24_4_ | (uint)!bVar20 * (int)auVar142._24_4_);
      uStack_504 = (uint)(bVar77 >> 7) * auVar105._28_4_ |
                   (uint)!(bool)(bVar77 >> 7) * (uint)(byte)(uVar96 >> 7) * auVar104._28_4_;
      auVar104 = vmulps_avx512vl(auVar108,auVar88);
      auVar151 = ZEXT3264(auVar104);
      auVar105 = vmulps_avx512vl(auVar108,auVar146);
      auVar163 = ZEXT3264(auVar105);
      auVar106 = vmulps_avx512vl(auVar103,auVar129);
      auVar106 = vaddps_avx512vl(auVar109,auVar106);
      auVar106 = vmulps_avx512vl(auVar115,auVar106);
      auVar103._0_4_ = auVar104._0_4_ + auVar106._0_4_;
      auVar103._4_4_ = auVar104._4_4_ + auVar106._4_4_;
      auVar103._8_4_ = auVar104._8_4_ + auVar106._8_4_;
      auVar103._12_4_ = auVar104._12_4_ + auVar106._12_4_;
      auVar103._16_4_ = auVar104._16_4_ + auVar106._16_4_;
      auVar103._20_4_ = auVar104._20_4_ + auVar106._20_4_;
      auVar103._24_4_ = auVar104._24_4_ + auVar106._24_4_;
      auVar103._28_4_ = auVar104._28_4_ + auVar106._28_4_;
      auVar102._4_4_ = auVar105._4_4_ * auVar130._4_4_;
      auVar102._0_4_ = auVar105._0_4_ * auVar130._0_4_;
      auVar102._8_4_ = auVar105._8_4_ * auVar130._8_4_;
      auVar102._12_4_ = auVar105._12_4_ * auVar130._12_4_;
      auVar102._16_4_ = auVar105._16_4_ * auVar130._16_4_;
      auVar102._20_4_ = auVar105._20_4_ * auVar130._20_4_;
      auVar102._24_4_ = auVar105._24_4_ * auVar130._24_4_;
      auVar102._28_4_ = auVar146._28_4_;
      auVar104 = vxorps_avx512vl(auVar108,auVar155);
      auVar157 = ZEXT3264(auVar104);
      auVar104 = vblendmps_avx512vl(auVar108,auVar104);
      bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
      bVar16 = (bool)((byte)(uVar96 >> 2) & 1);
      bVar17 = (bool)((byte)(uVar96 >> 3) & 1);
      bVar18 = (bool)((byte)(uVar96 >> 4) & 1);
      bVar19 = (bool)((byte)(uVar96 >> 5) & 1);
      bVar20 = (bool)((byte)(uVar96 >> 6) & 1);
      bVar21 = SUB81(uVar96 >> 7,0);
      auVar105 = vsubps_avx512vl(auVar103,auVar102);
      local_500[0] = (uint)(bVar77 & 1) * auVar105._0_4_ |
                     (uint)!(bool)(bVar77 & 1) *
                     ((uint)(bVar89 & 1) * auVar104._0_4_ | !(bool)(bVar89 & 1) * local_520[0]);
      bVar15 = (bool)(bVar77 >> 1 & 1);
      local_500[1] = (uint)bVar15 * auVar105._4_4_ |
                     (uint)!bVar15 * ((uint)bVar14 * auVar104._4_4_ | !bVar14 * local_520[1]);
      bVar14 = (bool)(bVar77 >> 2 & 1);
      local_500[2] = (uint)bVar14 * auVar105._8_4_ |
                     (uint)!bVar14 * ((uint)bVar16 * auVar104._8_4_ | !bVar16 * local_520[2]);
      bVar14 = (bool)(bVar77 >> 3 & 1);
      local_500[3] = (uint)bVar14 * auVar105._12_4_ |
                     (uint)!bVar14 * ((uint)bVar17 * auVar104._12_4_ | !bVar17 * local_520[3]);
      bVar14 = (bool)(bVar77 >> 4 & 1);
      uStack_4f0 = (uint)bVar14 * auVar105._16_4_ |
                   (uint)!bVar14 * ((uint)bVar18 * auVar104._16_4_ | !bVar18 * uStack_510);
      bVar14 = (bool)(bVar77 >> 5 & 1);
      uStack_4ec = (uint)bVar14 * auVar105._20_4_ |
                   (uint)!bVar14 * ((uint)bVar19 * auVar104._20_4_ | !bVar19 * uStack_50c);
      bVar14 = (bool)(bVar77 >> 6 & 1);
      uStack_4e8 = (uint)bVar14 * auVar105._24_4_ |
                   (uint)!bVar14 * ((uint)bVar20 * auVar104._24_4_ | !bVar20 * uStack_508);
      uStack_4e4 = (uint)(bVar77 >> 7) * auVar105._28_4_ |
                   (uint)!(bool)(bVar77 >> 7) *
                   ((uint)bVar21 * auVar104._28_4_ | !bVar21 * uStack_504);
      auVar104 = vblendmps_avx512vl(auVar116,local_560);
      auVar101._0_4_ = (uint)(bVar78 & 1) * auVar104._0_4_ | !(bool)(bVar78 & 1) * local_500[0];
      bVar14 = (bool)(bVar78 >> 1 & 1);
      auVar101._4_4_ = (uint)bVar14 * auVar104._4_4_ | !bVar14 * local_500[1];
      bVar14 = (bool)(bVar78 >> 2 & 1);
      auVar101._8_4_ = (uint)bVar14 * auVar104._8_4_ | !bVar14 * local_500[2];
      bVar14 = (bool)(bVar78 >> 3 & 1);
      auVar101._12_4_ = (uint)bVar14 * auVar104._12_4_ | !bVar14 * local_500[3];
      bVar14 = (bool)(bVar78 >> 4 & 1);
      auVar101._16_4_ = (uint)bVar14 * auVar104._16_4_ | !bVar14 * uStack_4f0;
      bVar14 = (bool)(bVar78 >> 5 & 1);
      auVar101._20_4_ = (uint)bVar14 * auVar104._20_4_ | !bVar14 * uStack_4ec;
      bVar14 = (bool)(bVar78 >> 6 & 1);
      auVar101._24_4_ = (uint)bVar14 * auVar104._24_4_ | !bVar14 * uStack_4e8;
      auVar101._28_4_ = (uint)(bVar78 >> 7) * auVar104._28_4_ | !(bool)(bVar78 >> 7) * uStack_4e4;
      auVar104 = vshufps_avx(auVar101,auVar101,0xb1);
      auVar104 = vminps_avx(auVar101,auVar104);
      auVar105 = vshufpd_avx(auVar104,auVar104,5);
      auVar104 = vminps_avx(auVar104,auVar105);
      auVar105 = vpermpd_avx2(auVar104,0x4e);
      auVar104 = vminps_avx(auVar104,auVar105);
      uVar71 = vcmpps_avx512vl(auVar101,auVar104,0);
      uVar92 = uVar95;
      if (((byte)uVar71 & bVar78) != 0) {
        uVar92 = (uint)((byte)uVar71 & bVar78);
      }
      uVar91 = 0;
      for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
        uVar91 = uVar91 + 1;
      }
      auVar104 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
      auVar179 = ZEXT3264(auVar104);
LAB_01cebbee:
      local_650.valid = (int *)local_620;
      uVar93 = uVar91 & 0xff;
      uVar92 = *(uint *)(local_1c0 + (ulong)uVar93 * 4);
      pGVar11 = (pSVar10->geometries).items[uVar92].ptr;
      local_650.ray = (RTCRayN *)ray;
      if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
        uVar95 = (uint)(byte)(~(byte)(1 << (uVar91 & 0x1f)) & (byte)uVar95);
LAB_01cebc3d:
        bVar14 = true;
      }
      else {
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
          local_220 = auVar153._0_32_;
          local_200 = auVar151._0_32_;
          local_1e0 = auVar157._0_32_;
          uVar98 = (ulong)(uVar93 * 4);
          local_140 = *(undefined4 *)((long)local_5a0 + uVar98);
          local_120 = *(undefined4 *)(local_580 + uVar98);
          local_e0 = vpbroadcastd_avx512vl();
          local_100._4_4_ = *(undefined4 *)((long)&(line->primIDs).field_0 + uVar98);
          uVar4 = *(undefined4 *)((long)local_540 + uVar98);
          auVar152._4_4_ = uVar4;
          auVar152._0_4_ = uVar4;
          auVar152._8_4_ = uVar4;
          auVar152._12_4_ = uVar4;
          auVar152._16_4_ = uVar4;
          auVar152._20_4_ = uVar4;
          auVar152._24_4_ = uVar4;
          auVar152._28_4_ = uVar4;
          uVar5 = *(undefined4 *)((long)local_520 + uVar98);
          local_180._4_4_ = uVar5;
          local_180._0_4_ = uVar5;
          local_180._8_4_ = uVar5;
          local_180._12_4_ = uVar5;
          local_180._16_4_ = uVar5;
          local_180._20_4_ = uVar5;
          local_180._24_4_ = uVar5;
          local_180._28_4_ = uVar5;
          local_160._4_4_ = *(undefined4 *)((long)local_500 + uVar98);
          local_1a0[0] = (RTCHitN)(char)uVar4;
          local_1a0[1] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_1a0[2] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_1a0[3] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_1a0[4] = (RTCHitN)(char)uVar4;
          local_1a0[5] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_1a0[6] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_1a0[7] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_1a0[8] = (RTCHitN)(char)uVar4;
          local_1a0[9] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_1a0[10] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_1a0[0xb] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_1a0[0xc] = (RTCHitN)(char)uVar4;
          local_1a0[0xd] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_1a0[0xe] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_1a0[0xf] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_1a0[0x10] = (RTCHitN)(char)uVar4;
          local_1a0[0x11] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_1a0[0x12] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_1a0[0x13] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_1a0[0x14] = (RTCHitN)(char)uVar4;
          local_1a0[0x15] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_1a0[0x16] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_1a0[0x17] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_1a0[0x18] = (RTCHitN)(char)uVar4;
          local_1a0[0x19] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_1a0[0x1a] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_1a0[0x1b] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_1a0[0x1c] = (RTCHitN)(char)uVar4;
          local_1a0[0x1d] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_1a0[0x1e] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_1a0[0x1f] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          vpcmpeqd_avx2(auVar152,auVar152);
          local_160._0_4_ = local_160._4_4_;
          local_160._8_4_ = local_160._4_4_;
          local_160._12_4_ = local_160._4_4_;
          local_160._16_4_ = local_160._4_4_;
          local_160._20_4_ = local_160._4_4_;
          local_160._24_4_ = local_160._4_4_;
          local_160._28_4_ = local_160._4_4_;
          uStack_13c = local_140;
          uStack_138 = local_140;
          uStack_134 = local_140;
          uStack_130 = local_140;
          uStack_12c = local_140;
          uStack_128 = local_140;
          uStack_124 = local_140;
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          local_100._0_4_ = local_100._4_4_;
          local_100._8_4_ = local_100._4_4_;
          local_100._12_4_ = local_100._4_4_;
          local_100._16_4_ = local_100._4_4_;
          local_100._20_4_ = local_100._4_4_;
          local_100._24_4_ = local_100._4_4_;
          local_100._28_4_ = local_100._4_4_;
          uStack_bc = context->user->instID[0];
          local_c0 = uStack_bc;
          uStack_b8 = uStack_bc;
          uStack_b4 = uStack_bc;
          uStack_b0 = uStack_bc;
          uStack_ac = uStack_bc;
          uStack_a8 = uStack_bc;
          uStack_a4 = uStack_bc;
          uStack_9c = context->user->instPrimID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uVar6 = *(uint *)(ray + k * 4 + 0x100);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_560 + uVar98);
          local_620 = auVar179._0_32_;
          local_650.geometryUserPtr = pGVar11->userPtr;
          local_650.context = context->user;
          local_650.hit = local_1a0;
          local_650.N = 8;
          local_5e0 = auVar169._0_32_;
          local_240 = auVar188._0_32_;
          local_260 = auVar189._0_32_;
          local_280 = auVar190._0_32_;
          local_2a0 = auVar191._0_32_;
          local_2c0 = auVar192._0_32_;
          local_2e0 = auVar193._0_32_;
          local_300 = auVar196._0_32_;
          local_320 = auVar197._0_32_;
          local_340 = iVar135;
          iStack_33c = iVar99;
          iStack_338 = iVar136;
          iStack_334 = iVar137;
          iStack_330 = iVar138;
          iStack_32c = iVar139;
          iStack_328 = iVar140;
          iStack_324 = iVar141;
          local_360 = auVar195._0_32_;
          local_380 = auVar186._0_32_;
          local_3a0 = auVar180._0_32_;
          local_3c0 = auVar181._0_32_;
          local_3e0 = auVar177._0_32_;
          local_400 = auVar182._0_32_;
          local_420 = auVar183._0_32_;
          local_440 = auVar184._0_32_;
          local_460 = auVar185._0_32_;
          local_480 = auVar194._0_32_;
          local_4a0 = auVar165._0_32_;
          local_4c0 = auVar163._0_32_;
          local_4e0 = local_620;
          uVar98 = uVar97;
          if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar11->intersectionFilterN)(&local_650);
            auVar179 = ZEXT3264(local_4e0);
            auVar163 = ZEXT3264(local_4c0);
            auVar165 = ZEXT3264(local_4a0);
            auVar194 = ZEXT3264(local_480);
            uVar98 = uVar97 & 0xffff;
            auVar185 = ZEXT3264(local_460);
            auVar184 = ZEXT3264(local_440);
            auVar183 = ZEXT3264(local_420);
            auVar182 = ZEXT3264(local_400);
            auVar177 = ZEXT3264(local_3e0);
            auVar181 = ZEXT3264(local_3c0);
            auVar180 = ZEXT3264(local_3a0);
            auVar186 = ZEXT3264(local_380);
            auVar195 = ZEXT3264(local_360);
            auVar197 = ZEXT3264(local_320);
            auVar196 = ZEXT3264(local_300);
            auVar193 = ZEXT3264(local_2e0);
            auVar192 = ZEXT3264(local_2c0);
            auVar191 = ZEXT3264(local_2a0);
            auVar190 = ZEXT3264(local_280);
            auVar189 = ZEXT3264(local_260);
            auVar188 = ZEXT3264(local_240);
            auVar169 = ZEXT3264(local_5e0);
            auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar187 = ZEXT3264(auVar104);
          }
          auVar157 = ZEXT3264(local_1e0);
          auVar151 = ZEXT3264(local_200);
          auVar153 = ZEXT3264(local_220);
          if (local_620 == (undefined1  [32])0x0) {
LAB_01cec1c6:
            auVar101 = ZEXT432(uVar6);
            *(uint *)(ray + k * 4 + 0x100) = uVar6;
          }
          else {
            p_Var13 = context->args->filter;
            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var13)(&local_650);
              auVar179 = ZEXT3264(local_4e0);
              auVar153 = ZEXT3264(local_220);
              auVar151 = ZEXT3264(local_200);
              auVar157 = ZEXT3264(local_1e0);
              auVar163 = ZEXT3264(local_4c0);
              auVar165 = ZEXT3264(local_4a0);
              auVar194 = ZEXT3264(local_480);
              uVar98 = uVar97 & 0xffff;
              auVar185 = ZEXT3264(local_460);
              auVar184 = ZEXT3264(local_440);
              auVar183 = ZEXT3264(local_420);
              auVar182 = ZEXT3264(local_400);
              auVar177 = ZEXT3264(local_3e0);
              auVar181 = ZEXT3264(local_3c0);
              auVar180 = ZEXT3264(local_3a0);
              auVar186 = ZEXT3264(local_380);
              auVar195 = ZEXT3264(local_360);
              auVar197 = ZEXT3264(local_320);
              auVar196 = ZEXT3264(local_300);
              auVar193 = ZEXT3264(local_2e0);
              auVar192 = ZEXT3264(local_2c0);
              auVar191 = ZEXT3264(local_2a0);
              auVar190 = ZEXT3264(local_280);
              auVar189 = ZEXT3264(local_260);
              auVar188 = ZEXT3264(local_240);
              auVar169 = ZEXT3264(local_5e0);
              auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar187 = ZEXT3264(auVar104);
            }
            if (local_620 == (undefined1  [32])0x0) goto LAB_01cec1c6;
            uVar76 = vptestmd_avx512vl(local_620,local_620);
            iVar99 = *(int *)(local_650.hit + 4);
            iVar135 = *(int *)(local_650.hit + 8);
            iVar136 = *(int *)(local_650.hit + 0xc);
            iVar137 = *(int *)(local_650.hit + 0x10);
            iVar138 = *(int *)(local_650.hit + 0x14);
            iVar139 = *(int *)(local_650.hit + 0x18);
            iVar140 = *(int *)(local_650.hit + 0x1c);
            bVar89 = (byte)uVar76;
            bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar76 >> 4) & 1);
            bVar18 = (bool)((byte)(uVar76 >> 5) & 1);
            bVar19 = (bool)((byte)(uVar76 >> 6) & 1);
            bVar20 = SUB81(uVar76 >> 7,0);
            *(uint *)(local_650.ray + 0x180) =
                 (uint)(bVar89 & 1) * *(int *)local_650.hit |
                 (uint)!(bool)(bVar89 & 1) * *(int *)(local_650.ray + 0x180);
            *(uint *)(local_650.ray + 0x184) =
                 (uint)bVar14 * iVar99 | (uint)!bVar14 * *(int *)(local_650.ray + 0x184);
            *(uint *)(local_650.ray + 0x188) =
                 (uint)bVar15 * iVar135 | (uint)!bVar15 * *(int *)(local_650.ray + 0x188);
            *(uint *)(local_650.ray + 0x18c) =
                 (uint)bVar16 * iVar136 | (uint)!bVar16 * *(int *)(local_650.ray + 0x18c);
            *(uint *)(local_650.ray + 400) =
                 (uint)bVar17 * iVar137 | (uint)!bVar17 * *(int *)(local_650.ray + 400);
            *(uint *)(local_650.ray + 0x194) =
                 (uint)bVar18 * iVar138 | (uint)!bVar18 * *(int *)(local_650.ray + 0x194);
            *(uint *)(local_650.ray + 0x198) =
                 (uint)bVar19 * iVar139 | (uint)!bVar19 * *(int *)(local_650.ray + 0x198);
            *(uint *)(local_650.ray + 0x19c) =
                 (uint)bVar20 * iVar140 | (uint)!bVar20 * *(int *)(local_650.ray + 0x19c);
            iVar99 = *(int *)(local_650.hit + 0x24);
            iVar135 = *(int *)(local_650.hit + 0x28);
            iVar136 = *(int *)(local_650.hit + 0x2c);
            iVar137 = *(int *)(local_650.hit + 0x30);
            iVar138 = *(int *)(local_650.hit + 0x34);
            iVar139 = *(int *)(local_650.hit + 0x38);
            iVar140 = *(int *)(local_650.hit + 0x3c);
            bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar76 >> 4) & 1);
            bVar18 = (bool)((byte)(uVar76 >> 5) & 1);
            bVar19 = (bool)((byte)(uVar76 >> 6) & 1);
            bVar20 = SUB81(uVar76 >> 7,0);
            *(uint *)(local_650.ray + 0x1a0) =
                 (uint)(bVar89 & 1) * *(int *)(local_650.hit + 0x20) |
                 (uint)!(bool)(bVar89 & 1) * *(int *)(local_650.ray + 0x1a0);
            *(uint *)(local_650.ray + 0x1a4) =
                 (uint)bVar14 * iVar99 | (uint)!bVar14 * *(int *)(local_650.ray + 0x1a4);
            *(uint *)(local_650.ray + 0x1a8) =
                 (uint)bVar15 * iVar135 | (uint)!bVar15 * *(int *)(local_650.ray + 0x1a8);
            *(uint *)(local_650.ray + 0x1ac) =
                 (uint)bVar16 * iVar136 | (uint)!bVar16 * *(int *)(local_650.ray + 0x1ac);
            *(uint *)(local_650.ray + 0x1b0) =
                 (uint)bVar17 * iVar137 | (uint)!bVar17 * *(int *)(local_650.ray + 0x1b0);
            *(uint *)(local_650.ray + 0x1b4) =
                 (uint)bVar18 * iVar138 | (uint)!bVar18 * *(int *)(local_650.ray + 0x1b4);
            *(uint *)(local_650.ray + 0x1b8) =
                 (uint)bVar19 * iVar139 | (uint)!bVar19 * *(int *)(local_650.ray + 0x1b8);
            *(uint *)(local_650.ray + 0x1bc) =
                 (uint)bVar20 * iVar140 | (uint)!bVar20 * *(int *)(local_650.ray + 0x1bc);
            iVar99 = *(int *)(local_650.hit + 0x44);
            iVar135 = *(int *)(local_650.hit + 0x48);
            iVar136 = *(int *)(local_650.hit + 0x4c);
            iVar137 = *(int *)(local_650.hit + 0x50);
            iVar138 = *(int *)(local_650.hit + 0x54);
            iVar139 = *(int *)(local_650.hit + 0x58);
            iVar140 = *(int *)(local_650.hit + 0x5c);
            bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar76 >> 4) & 1);
            bVar18 = (bool)((byte)(uVar76 >> 5) & 1);
            bVar19 = (bool)((byte)(uVar76 >> 6) & 1);
            bVar20 = SUB81(uVar76 >> 7,0);
            *(uint *)(local_650.ray + 0x1c0) =
                 (uint)(bVar89 & 1) * *(int *)(local_650.hit + 0x40) |
                 (uint)!(bool)(bVar89 & 1) * *(int *)(local_650.ray + 0x1c0);
            *(uint *)(local_650.ray + 0x1c4) =
                 (uint)bVar14 * iVar99 | (uint)!bVar14 * *(int *)(local_650.ray + 0x1c4);
            *(uint *)(local_650.ray + 0x1c8) =
                 (uint)bVar15 * iVar135 | (uint)!bVar15 * *(int *)(local_650.ray + 0x1c8);
            *(uint *)(local_650.ray + 0x1cc) =
                 (uint)bVar16 * iVar136 | (uint)!bVar16 * *(int *)(local_650.ray + 0x1cc);
            *(uint *)(local_650.ray + 0x1d0) =
                 (uint)bVar17 * iVar137 | (uint)!bVar17 * *(int *)(local_650.ray + 0x1d0);
            *(uint *)(local_650.ray + 0x1d4) =
                 (uint)bVar18 * iVar138 | (uint)!bVar18 * *(int *)(local_650.ray + 0x1d4);
            *(uint *)(local_650.ray + 0x1d8) =
                 (uint)bVar19 * iVar139 | (uint)!bVar19 * *(int *)(local_650.ray + 0x1d8);
            *(uint *)(local_650.ray + 0x1dc) =
                 (uint)bVar20 * iVar140 | (uint)!bVar20 * *(int *)(local_650.ray + 0x1dc);
            iVar99 = *(int *)(local_650.hit + 100);
            iVar135 = *(int *)(local_650.hit + 0x68);
            iVar136 = *(int *)(local_650.hit + 0x6c);
            iVar137 = *(int *)(local_650.hit + 0x70);
            iVar138 = *(int *)(local_650.hit + 0x74);
            iVar139 = *(int *)(local_650.hit + 0x78);
            iVar140 = *(int *)(local_650.hit + 0x7c);
            bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar76 >> 4) & 1);
            bVar18 = (bool)((byte)(uVar76 >> 5) & 1);
            bVar19 = (bool)((byte)(uVar76 >> 6) & 1);
            bVar20 = SUB81(uVar76 >> 7,0);
            *(uint *)(local_650.ray + 0x1e0) =
                 (uint)(bVar89 & 1) * *(int *)(local_650.hit + 0x60) |
                 (uint)!(bool)(bVar89 & 1) * *(int *)(local_650.ray + 0x1e0);
            *(uint *)(local_650.ray + 0x1e4) =
                 (uint)bVar14 * iVar99 | (uint)!bVar14 * *(int *)(local_650.ray + 0x1e4);
            *(uint *)(local_650.ray + 0x1e8) =
                 (uint)bVar15 * iVar135 | (uint)!bVar15 * *(int *)(local_650.ray + 0x1e8);
            *(uint *)(local_650.ray + 0x1ec) =
                 (uint)bVar16 * iVar136 | (uint)!bVar16 * *(int *)(local_650.ray + 0x1ec);
            *(uint *)(local_650.ray + 0x1f0) =
                 (uint)bVar17 * iVar137 | (uint)!bVar17 * *(int *)(local_650.ray + 0x1f0);
            *(uint *)(local_650.ray + 500) =
                 (uint)bVar18 * iVar138 | (uint)!bVar18 * *(int *)(local_650.ray + 500);
            *(uint *)(local_650.ray + 0x1f8) =
                 (uint)bVar19 * iVar139 | (uint)!bVar19 * *(int *)(local_650.ray + 0x1f8);
            *(uint *)(local_650.ray + 0x1fc) =
                 (uint)bVar20 * iVar140 | (uint)!bVar20 * *(int *)(local_650.ray + 0x1fc);
            iVar99 = *(int *)(local_650.hit + 0x84);
            iVar135 = *(int *)(local_650.hit + 0x88);
            iVar136 = *(int *)(local_650.hit + 0x8c);
            iVar137 = *(int *)(local_650.hit + 0x90);
            iVar138 = *(int *)(local_650.hit + 0x94);
            iVar139 = *(int *)(local_650.hit + 0x98);
            iVar140 = *(int *)(local_650.hit + 0x9c);
            bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar76 >> 4) & 1);
            bVar18 = (bool)((byte)(uVar76 >> 5) & 1);
            bVar19 = (bool)((byte)(uVar76 >> 6) & 1);
            bVar20 = SUB81(uVar76 >> 7,0);
            *(uint *)(local_650.ray + 0x200) =
                 (uint)(bVar89 & 1) * *(int *)(local_650.hit + 0x80) |
                 (uint)!(bool)(bVar89 & 1) * *(int *)(local_650.ray + 0x200);
            *(uint *)(local_650.ray + 0x204) =
                 (uint)bVar14 * iVar99 | (uint)!bVar14 * *(int *)(local_650.ray + 0x204);
            *(uint *)(local_650.ray + 0x208) =
                 (uint)bVar15 * iVar135 | (uint)!bVar15 * *(int *)(local_650.ray + 0x208);
            *(uint *)(local_650.ray + 0x20c) =
                 (uint)bVar16 * iVar136 | (uint)!bVar16 * *(int *)(local_650.ray + 0x20c);
            *(uint *)(local_650.ray + 0x210) =
                 (uint)bVar17 * iVar137 | (uint)!bVar17 * *(int *)(local_650.ray + 0x210);
            *(uint *)(local_650.ray + 0x214) =
                 (uint)bVar18 * iVar138 | (uint)!bVar18 * *(int *)(local_650.ray + 0x214);
            *(uint *)(local_650.ray + 0x218) =
                 (uint)bVar19 * iVar139 | (uint)!bVar19 * *(int *)(local_650.ray + 0x218);
            *(uint *)(local_650.ray + 0x21c) =
                 (uint)bVar20 * iVar140 | (uint)!bVar20 * *(int *)(local_650.ray + 0x21c);
            auVar104 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xa0));
            *(undefined1 (*) [32])(local_650.ray + 0x220) = auVar104;
            auVar104 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xc0));
            *(undefined1 (*) [32])(local_650.ray + 0x240) = auVar104;
            auVar104 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xe0));
            *(undefined1 (*) [32])(local_650.ray + 0x260) = auVar104;
            auVar101 = *(undefined1 (*) [32])(local_650.hit + 0x100);
            auVar104 = vmovdqa32_avx512vl(auVar101);
            *(undefined1 (*) [32])(local_650.ray + 0x280) = auVar104;
          }
          uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar81._4_4_ = uVar4;
          auVar81._0_4_ = uVar4;
          auVar81._8_4_ = uVar4;
          auVar81._12_4_ = uVar4;
          auVar81._16_4_ = uVar4;
          auVar81._20_4_ = uVar4;
          auVar81._24_4_ = uVar4;
          auVar81._28_4_ = uVar4;
          uVar71 = vcmpps_avx512vl(auVar153._0_32_,auVar81,2);
          uVar95 = (uint)(byte)(~(byte)(1 << (uVar91 & 0x1f)) & (byte)uVar95) & (uint)uVar71;
          uVar97 = uVar98;
          iVar135 = local_340;
          iVar99 = iStack_33c;
          iVar136 = iStack_338;
          iVar137 = iStack_334;
          iVar138 = iStack_330;
          iVar139 = iStack_32c;
          iVar140 = iStack_328;
          iVar141 = iStack_324;
          goto LAB_01cebc3d;
        }
        bVar14 = false;
      }
      if (bVar14) {
        bVar89 = (byte)uVar95;
        if (bVar89 == 0) goto LAB_01cec29d;
        auVar104 = vblendmps_avx512vl(auVar187._0_32_,auVar153._0_32_);
        auVar132._0_4_ =
             (uint)(bVar89 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar89 & 1) * auVar101._0_4_;
        bVar14 = (bool)((byte)(uVar95 >> 1) & 1);
        auVar132._4_4_ = (uint)bVar14 * auVar104._4_4_ | (uint)!bVar14 * auVar101._4_4_;
        bVar14 = (bool)((byte)(uVar95 >> 2) & 1);
        auVar132._8_4_ = (uint)bVar14 * auVar104._8_4_ | (uint)!bVar14 * auVar101._8_4_;
        bVar14 = (bool)((byte)(uVar95 >> 3) & 1);
        auVar132._12_4_ = (uint)bVar14 * auVar104._12_4_ | (uint)!bVar14 * auVar101._12_4_;
        bVar14 = (bool)((byte)(uVar95 >> 4) & 1);
        auVar132._16_4_ = (uint)bVar14 * auVar104._16_4_ | (uint)!bVar14 * auVar101._16_4_;
        bVar14 = (bool)((byte)(uVar95 >> 5) & 1);
        auVar132._20_4_ = (uint)bVar14 * auVar104._20_4_ | (uint)!bVar14 * auVar101._20_4_;
        bVar14 = (bool)((byte)(uVar95 >> 6) & 1);
        auVar132._24_4_ = (uint)bVar14 * auVar104._24_4_ | (uint)!bVar14 * auVar101._24_4_;
        auVar132._28_4_ =
             (uVar95 >> 7) * auVar104._28_4_ | (uint)!SUB41(uVar95 >> 7,0) * auVar101._28_4_;
        auVar104 = vshufps_avx(auVar132,auVar132,0xb1);
        auVar104 = vminps_avx(auVar132,auVar104);
        auVar105 = vshufpd_avx(auVar104,auVar104,5);
        auVar104 = vminps_avx(auVar104,auVar105);
        auVar105 = vpermpd_avx2(auVar104,0x4e);
        auVar104 = vminps_avx(auVar104,auVar105);
        uVar71 = vcmpps_avx512vl(auVar132,auVar104,0);
        bVar89 = (byte)uVar71 & bVar89;
        uVar92 = uVar95;
        if (bVar89 != 0) {
          uVar92 = (uint)bVar89;
        }
        uVar91 = 0;
        for (; auVar101 = auVar132, (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
          uVar91 = uVar91 + 1;
        }
        goto LAB_01cebbee;
      }
      uVar98 = (ulong)(uVar93 << 2);
      uVar4 = *(undefined4 *)((long)local_5a0 + uVar98);
      uVar5 = *(undefined4 *)(local_580 + uVar98);
      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_560 + uVar98);
      *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)((long)local_540 + uVar98);
      *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)((long)local_520 + uVar98);
      *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)((long)local_500 + uVar98);
      *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar4;
      *(undefined4 *)(ray + k * 4 + 0x200) = uVar5;
      *(undefined4 *)(ray + k * 4 + 0x220) =
           *(undefined4 *)((long)&(line->primIDs).field_0 + uVar98);
      *(uint *)(ray + k * 4 + 0x240) = uVar92;
      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_01cec29d:
      uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar79._4_4_ = uVar4;
      auVar79._0_4_ = uVar4;
      auVar79._8_4_ = uVar4;
      auVar79._12_4_ = uVar4;
      auVar79._16_4_ = uVar4;
      auVar79._20_4_ = uVar4;
      auVar79._24_4_ = uVar4;
      auVar79._28_4_ = uVar4;
      local_560 = auVar169._0_32_;
      uVar71 = vcmpps_avx512vl(local_560,auVar79,2);
      bVar90 = (byte)uVar97 & (byte)uVar71 & bVar94 & bVar90;
      uVar95 = (uint)bVar90;
      if (bVar90 != 0) {
        auVar106 = auVar182._0_32_;
        uVar71 = vcmpps_avx512vl(auVar106,auVar180._0_32_,0);
        uVar72 = vcmpps_avx512vl(auVar106,auVar181._0_32_,0);
        bVar78 = (byte)uVar71 | (byte)uVar72;
        uVar98 = vcmpps_avx512vl(auVar106,auVar186._0_32_,0);
        auVar104 = vmulps_avx512vl(auVar188._0_32_,auVar106);
        auVar105 = vmulps_avx512vl(auVar189._0_32_,auVar106);
        auVar106 = vmulps_avx512vl(auVar190._0_32_,auVar106);
        auVar143._0_4_ = auVar104._0_4_ + (float)local_600._0_4_;
        auVar143._4_4_ = auVar104._4_4_ + (float)local_600._4_4_;
        auVar143._8_4_ = auVar104._8_4_ + fStack_5f8;
        auVar143._12_4_ = auVar104._12_4_ + fStack_5f4;
        auVar143._16_4_ = auVar104._16_4_ + fStack_5f0;
        auVar143._20_4_ = auVar104._20_4_ + fStack_5ec;
        auVar143._24_4_ = auVar104._24_4_ + fStack_5e8;
        auVar143._28_4_ = auVar104._28_4_ + fStack_5e4;
        auVar145._0_4_ = auVar105._0_4_ + (float)local_5c0._0_4_;
        auVar145._4_4_ = auVar105._4_4_ + (float)local_5c0._4_4_;
        auVar145._8_4_ = auVar105._8_4_ + fStack_5b8;
        auVar145._12_4_ = auVar105._12_4_ + fStack_5b4;
        auVar145._16_4_ = auVar105._16_4_ + fStack_5b0;
        auVar145._20_4_ = auVar105._20_4_ + fStack_5ac;
        auVar145._24_4_ = auVar105._24_4_ + fStack_5a8;
        auVar145._28_4_ = auVar105._28_4_ + fStack_5a4;
        auVar104 = vaddps_avx512vl(auVar196._0_32_,auVar106);
        auVar113 = auVar197._0_32_;
        auVar105 = vmulps_avx512vl(auVar113,auVar143);
        auVar106 = vmulps_avx512vl(auVar113,auVar145);
        auVar104 = vmulps_avx512vl(auVar113,auVar104);
        auVar144._0_4_ = auVar105._0_4_ + (float)local_80._0_4_;
        auVar144._4_4_ = auVar105._4_4_ + (float)local_80._4_4_;
        auVar144._8_4_ = auVar105._8_4_ + fStack_78;
        auVar144._12_4_ = auVar105._12_4_ + fStack_74;
        auVar144._16_4_ = auVar105._16_4_ + fStack_70;
        auVar144._20_4_ = auVar105._20_4_ + fStack_6c;
        auVar144._24_4_ = auVar105._24_4_ + fStack_68;
        auVar144._28_4_ = auVar105._28_4_ + fStack_64;
        auVar105 = vaddps_avx512vl(auVar183._0_32_,auVar106);
        auVar147._0_4_ = auVar151._0_4_ + auVar104._0_4_;
        auVar147._4_4_ = auVar151._4_4_ + auVar104._4_4_;
        auVar147._8_4_ = auVar151._8_4_ + auVar104._8_4_;
        auVar147._12_4_ = auVar151._12_4_ + auVar104._12_4_;
        auVar147._16_4_ = auVar151._16_4_ + auVar104._16_4_;
        auVar147._20_4_ = auVar151._20_4_ + auVar104._20_4_;
        auVar147._24_4_ = auVar151._24_4_ + auVar104._24_4_;
        auVar147._28_4_ = auVar151._28_4_ + auVar104._28_4_;
        auVar109 = auVar195._0_32_;
        auVar104 = vmulps_avx512vl(auVar184._0_32_,auVar109);
        auVar106 = vmulps_avx512vl(auVar185._0_32_,auVar109);
        auVar131 = auVar163._0_32_;
        auVar113 = vmulps_avx512vl(auVar131,auVar109);
        bVar89 = (byte)uVar98;
        bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
        bVar20 = (bool)((byte)(uVar98 >> 2) & 1);
        bVar31 = (bool)((byte)(uVar98 >> 3) & 1);
        bVar49 = (bool)((byte)(uVar98 >> 4) & 1);
        bVar32 = (bool)((byte)(uVar98 >> 5) & 1);
        bVar41 = (bool)((byte)(uVar98 >> 6) & 1);
        bVar50 = SUB81(uVar98 >> 7,0);
        bVar15 = (bool)((byte)(uVar98 >> 1) & 1);
        bVar21 = (bool)((byte)(uVar98 >> 2) & 1);
        bVar38 = (bool)((byte)(uVar98 >> 3) & 1);
        bVar25 = (bool)((byte)(uVar98 >> 4) & 1);
        bVar33 = (bool)((byte)(uVar98 >> 5) & 1);
        bVar42 = (bool)((byte)(uVar98 >> 6) & 1);
        bVar51 = SUB81(uVar98 >> 7,0);
        bVar16 = (bool)((byte)(uVar98 >> 1) & 1);
        bVar22 = (bool)((byte)(uVar98 >> 2) & 1);
        bVar39 = (bool)((byte)(uVar98 >> 3) & 1);
        bVar26 = (bool)((byte)(uVar98 >> 4) & 1);
        bVar34 = (bool)((byte)(uVar98 >> 5) & 1);
        bVar43 = (bool)((byte)(uVar98 >> 6) & 1);
        bVar52 = SUB81(uVar98 >> 7,0);
        auVar104 = vsubps_avx512vl(auVar144,auVar104);
        bVar17 = (bool)(bVar78 >> 1 & 1);
        bVar23 = (bool)(bVar78 >> 2 & 1);
        bVar47 = (bool)(bVar78 >> 3 & 1);
        bVar27 = (bool)(bVar78 >> 4 & 1);
        bVar35 = (bool)(bVar78 >> 5 & 1);
        bVar44 = (bool)(bVar78 >> 6 & 1);
        auVar105 = vsubps_avx512vl(auVar105,auVar106);
        bVar18 = (bool)(bVar78 >> 1 & 1);
        bVar24 = (bool)(bVar78 >> 2 & 1);
        bVar48 = (bool)(bVar78 >> 3 & 1);
        bVar28 = (bool)(bVar78 >> 4 & 1);
        bVar36 = (bool)(bVar78 >> 5 & 1);
        bVar45 = (bool)(bVar78 >> 6 & 1);
        auVar106 = vmulps_avx512vl(auVar109,auVar177._0_32_);
        bVar19 = (bool)(bVar78 >> 1 & 1);
        bVar30 = (bool)(bVar78 >> 2 & 1);
        bVar40 = (bool)(bVar78 >> 3 & 1);
        bVar29 = (bool)(bVar78 >> 4 & 1);
        bVar37 = (bool)(bVar78 >> 5 & 1);
        bVar46 = (bool)(bVar78 >> 6 & 1);
        local_5a0[0] = (uint)(bVar78 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar78 & 1) * iVar135;
        local_5a0[1] = (uint)bVar19 * auVar106._4_4_ | (uint)!bVar19 * iVar99;
        local_5a0[2] = (uint)bVar30 * auVar106._8_4_ | (uint)!bVar30 * iVar136;
        local_5a0[3] = (uint)bVar40 * auVar106._12_4_ | (uint)!bVar40 * iVar137;
        uStack_590 = (uint)bVar29 * auVar106._16_4_ | (uint)!bVar29 * iVar138;
        uStack_58c = (uint)bVar37 * auVar106._20_4_ | (uint)!bVar37 * iVar139;
        uStack_588 = (uint)bVar46 * auVar106._24_4_ | (uint)!bVar46 * iVar140;
        uStack_584 = (uint)(bVar78 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar78 >> 7) * iVar141;
        local_580 = ZEXT432(0) << 0x20;
        local_540[0] = (uint)(bVar78 & 1) * auVar104._0_4_ |
                       (uint)!(bool)(bVar78 & 1) *
                       ((uint)(bVar89 & 1) * auVar194._0_4_ |
                       (uint)!(bool)(bVar89 & 1) * auVar193._0_4_);
        local_540[1] = (uint)bVar17 * auVar104._4_4_ |
                       (uint)!bVar17 *
                       ((uint)bVar14 * auVar194._4_4_ | (uint)!bVar14 * auVar193._4_4_);
        local_540[2] = (uint)bVar23 * auVar104._8_4_ |
                       (uint)!bVar23 *
                       ((uint)bVar20 * auVar194._8_4_ | (uint)!bVar20 * auVar193._8_4_);
        local_540[3] = (uint)bVar47 * auVar104._12_4_ |
                       (uint)!bVar47 *
                       ((uint)bVar31 * auVar194._12_4_ | (uint)!bVar31 * auVar193._12_4_);
        uStack_530 = (uint)bVar27 * auVar104._16_4_ |
                     (uint)!bVar27 *
                     ((uint)bVar49 * auVar194._16_4_ | (uint)!bVar49 * auVar193._16_4_);
        uStack_52c = (uint)bVar35 * auVar104._20_4_ |
                     (uint)!bVar35 *
                     ((uint)bVar32 * auVar194._20_4_ | (uint)!bVar32 * auVar193._20_4_);
        uStack_528 = (uint)bVar44 * auVar104._24_4_ |
                     (uint)!bVar44 *
                     ((uint)bVar41 * auVar194._24_4_ | (uint)!bVar41 * auVar193._24_4_);
        uStack_524 = (uint)(bVar78 >> 7) * auVar104._28_4_ |
                     (uint)!(bool)(bVar78 >> 7) *
                     ((uint)bVar50 * auVar194._28_4_ | (uint)!bVar50 * auVar193._28_4_);
        auVar104 = vsubps_avx512vl(auVar147,auVar113);
        bVar14 = (bool)(bVar78 >> 1 & 1);
        bVar17 = (bool)(bVar78 >> 2 & 1);
        bVar19 = (bool)(bVar78 >> 3 & 1);
        bVar20 = (bool)(bVar78 >> 4 & 1);
        bVar23 = (bool)(bVar78 >> 5 & 1);
        bVar30 = (bool)(bVar78 >> 6 & 1);
        local_520[0] = (uint)(bVar78 & 1) * auVar105._0_4_ |
                       (uint)!(bool)(bVar78 & 1) *
                       ((uint)(bVar89 & 1) * auVar165._0_4_ |
                       (uint)!(bool)(bVar89 & 1) * auVar191._0_4_);
        local_520[1] = (uint)bVar18 * auVar105._4_4_ |
                       (uint)!bVar18 *
                       ((uint)bVar15 * auVar165._4_4_ | (uint)!bVar15 * auVar191._4_4_);
        local_520[2] = (uint)bVar24 * auVar105._8_4_ |
                       (uint)!bVar24 *
                       ((uint)bVar21 * auVar165._8_4_ | (uint)!bVar21 * auVar191._8_4_);
        local_520[3] = (uint)bVar48 * auVar105._12_4_ |
                       (uint)!bVar48 *
                       ((uint)bVar38 * auVar165._12_4_ | (uint)!bVar38 * auVar191._12_4_);
        uStack_510 = (uint)bVar28 * auVar105._16_4_ |
                     (uint)!bVar28 *
                     ((uint)bVar25 * auVar165._16_4_ | (uint)!bVar25 * auVar191._16_4_);
        uStack_50c = (uint)bVar36 * auVar105._20_4_ |
                     (uint)!bVar36 *
                     ((uint)bVar33 * auVar165._20_4_ | (uint)!bVar33 * auVar191._20_4_);
        uStack_508 = (uint)bVar45 * auVar105._24_4_ |
                     (uint)!bVar45 *
                     ((uint)bVar42 * auVar165._24_4_ | (uint)!bVar42 * auVar191._24_4_);
        uStack_504 = (uint)(bVar78 >> 7) * auVar105._28_4_ |
                     (uint)!(bool)(bVar78 >> 7) *
                     ((uint)bVar51 * auVar165._28_4_ | (uint)!bVar51 * auVar191._28_4_);
        local_500[0] = (uint)(bVar78 & 1) * auVar104._0_4_ |
                       (uint)!(bool)(bVar78 & 1) *
                       ((uint)(bVar89 & 1) * auVar157._0_4_ |
                       (uint)!(bool)(bVar89 & 1) * auVar192._0_4_);
        local_500[1] = (uint)bVar14 * auVar104._4_4_ |
                       (uint)!bVar14 *
                       ((uint)bVar16 * auVar157._4_4_ | (uint)!bVar16 * auVar192._4_4_);
        local_500[2] = (uint)bVar17 * auVar104._8_4_ |
                       (uint)!bVar17 *
                       ((uint)bVar22 * auVar157._8_4_ | (uint)!bVar22 * auVar192._8_4_);
        local_500[3] = (uint)bVar19 * auVar104._12_4_ |
                       (uint)!bVar19 *
                       ((uint)bVar39 * auVar157._12_4_ | (uint)!bVar39 * auVar192._12_4_);
        uStack_4f0 = (uint)bVar20 * auVar104._16_4_ |
                     (uint)!bVar20 *
                     ((uint)bVar26 * auVar157._16_4_ | (uint)!bVar26 * auVar192._16_4_);
        uStack_4ec = (uint)bVar23 * auVar104._20_4_ |
                     (uint)!bVar23 *
                     ((uint)bVar34 * auVar157._20_4_ | (uint)!bVar34 * auVar192._20_4_);
        uStack_4e8 = (uint)bVar30 * auVar104._24_4_ |
                     (uint)!bVar30 *
                     ((uint)bVar43 * auVar157._24_4_ | (uint)!bVar43 * auVar192._24_4_);
        uStack_4e4 = (uint)(bVar78 >> 7) * auVar104._28_4_ |
                     (uint)!(bool)(bVar78 >> 7) *
                     ((uint)bVar52 * auVar157._28_4_ | (uint)!bVar52 * auVar192._28_4_);
        pSVar10 = context->scene;
        auVar104 = vblendmps_avx512vl(auVar187._0_32_,local_560);
        auVar133._4_4_ = (uint)(bVar90 >> 1 & 1) * auVar104._4_4_;
        auVar133._0_4_ = (uint)(bVar90 & 1) * auVar104._0_4_;
        auVar133._8_4_ = (uint)(bVar90 >> 2 & 1) * auVar104._8_4_;
        auVar133._12_4_ = (uint)(bVar90 >> 3 & 1) * auVar104._12_4_;
        auVar133._16_4_ = (uint)(bVar90 >> 4 & 1) * auVar104._16_4_;
        auVar133._20_4_ = (uint)(bVar90 >> 5 & 1) * auVar104._20_4_;
        auVar133._24_4_ = (uint)(bVar90 >> 6 & 1) * auVar104._24_4_;
        auVar133._28_4_ = (uint)(bVar90 >> 7) * auVar104._28_4_;
        auVar104 = vshufps_avx(auVar133,auVar133,0xb1);
        auVar104 = vminps_avx(auVar133,auVar104);
        auVar105 = vshufpd_avx(auVar104,auVar104,5);
        auVar104 = vminps_avx(auVar104,auVar105);
        auVar105 = vpermpd_avx2(auVar104,0x4e);
        auVar104 = vminps_avx(auVar104,auVar105);
        uVar71 = vcmpps_avx512vl(auVar133,auVar104,0);
        uVar92 = uVar95;
        if (((byte)uVar71 & bVar90) != 0) {
          uVar92 = (uint)((byte)uVar71 & bVar90);
        }
        uVar91 = 0;
        for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
          uVar91 = uVar91 + 1;
        }
        auVar104 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
        auVar188 = ZEXT3264(auVar104);
        auVar104 = vpcmpeqd_avx2(auVar131,auVar131);
        auVar189 = ZEXT3264(auVar104);
        do {
          local_650.valid = (int *)local_620;
          uVar93 = uVar91 & 0xff;
          uVar92 = *(uint *)(local_1c0 + (ulong)uVar93 * 4);
          pGVar11 = (pSVar10->geometries).items[uVar92].ptr;
          if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
            uVar95 = (uint)(byte)(~(byte)(1 << (uVar91 & 0x1f)) & (byte)uVar95);
LAB_01cec43e:
            bVar14 = true;
          }
          else {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              uVar98 = (ulong)(uVar93 * 4);
              local_140 = *(undefined4 *)((long)local_5a0 + uVar98);
              local_120 = *(undefined4 *)(local_580 + uVar98);
              local_e0 = vpbroadcastd_avx512vl();
              uVar4 = *(undefined4 *)((long)&(line->primIDs).field_0 + uVar98);
              local_100._4_4_ = uVar4;
              local_100._0_4_ = uVar4;
              local_100._8_4_ = uVar4;
              local_100._12_4_ = uVar4;
              local_100._16_4_ = uVar4;
              local_100._20_4_ = uVar4;
              local_100._24_4_ = uVar4;
              local_100._28_4_ = uVar4;
              uVar4 = *(undefined4 *)((long)local_540 + uVar98);
              uVar5 = *(undefined4 *)((long)local_520 + uVar98);
              local_180._4_4_ = uVar5;
              local_180._0_4_ = uVar5;
              local_180._8_4_ = uVar5;
              local_180._12_4_ = uVar5;
              local_180._16_4_ = uVar5;
              local_180._20_4_ = uVar5;
              local_180._24_4_ = uVar5;
              local_180._28_4_ = uVar5;
              uVar5 = *(undefined4 *)((long)local_500 + uVar98);
              local_160._4_4_ = uVar5;
              local_160._0_4_ = uVar5;
              local_160._8_4_ = uVar5;
              local_160._12_4_ = uVar5;
              local_160._16_4_ = uVar5;
              local_160._20_4_ = uVar5;
              local_160._24_4_ = uVar5;
              local_160._28_4_ = uVar5;
              local_1a0[0] = (RTCHitN)(char)uVar4;
              local_1a0[1] = (RTCHitN)(char)((uint)uVar4 >> 8);
              local_1a0[2] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
              local_1a0[3] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
              local_1a0[4] = (RTCHitN)(char)uVar4;
              local_1a0[5] = (RTCHitN)(char)((uint)uVar4 >> 8);
              local_1a0[6] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
              local_1a0[7] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
              local_1a0[8] = (RTCHitN)(char)uVar4;
              local_1a0[9] = (RTCHitN)(char)((uint)uVar4 >> 8);
              local_1a0[10] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
              local_1a0[0xb] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
              local_1a0[0xc] = (RTCHitN)(char)uVar4;
              local_1a0[0xd] = (RTCHitN)(char)((uint)uVar4 >> 8);
              local_1a0[0xe] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
              local_1a0[0xf] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
              local_1a0[0x10] = (RTCHitN)(char)uVar4;
              local_1a0[0x11] = (RTCHitN)(char)((uint)uVar4 >> 8);
              local_1a0[0x12] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
              local_1a0[0x13] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
              local_1a0[0x14] = (RTCHitN)(char)uVar4;
              local_1a0[0x15] = (RTCHitN)(char)((uint)uVar4 >> 8);
              local_1a0[0x16] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
              local_1a0[0x17] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
              local_1a0[0x18] = (RTCHitN)(char)uVar4;
              local_1a0[0x19] = (RTCHitN)(char)((uint)uVar4 >> 8);
              local_1a0[0x1a] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
              local_1a0[0x1b] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
              local_1a0[0x1c] = (RTCHitN)(char)uVar4;
              local_1a0[0x1d] = (RTCHitN)(char)((uint)uVar4 >> 8);
              local_1a0[0x1e] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
              local_1a0[0x1f] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
              uStack_13c = local_140;
              uStack_138 = local_140;
              uStack_134 = local_140;
              uStack_130 = local_140;
              uStack_12c = local_140;
              uStack_128 = local_140;
              uStack_124 = local_140;
              uStack_11c = local_120;
              uStack_118 = local_120;
              uStack_114 = local_120;
              uStack_110 = local_120;
              uStack_10c = local_120;
              uStack_108 = local_120;
              uStack_104 = local_120;
              uStack_bc = context->user->instID[0];
              local_c0 = uStack_bc;
              uStack_b8 = uStack_bc;
              uStack_b4 = uStack_bc;
              uStack_b0 = uStack_bc;
              uStack_ac = uStack_bc;
              uStack_a8 = uStack_bc;
              uStack_a4 = uStack_bc;
              uStack_9c = context->user->instPrimID[0];
              local_a0 = uStack_9c;
              uStack_98 = uStack_9c;
              uStack_94 = uStack_9c;
              uStack_90 = uStack_9c;
              uStack_8c = uStack_9c;
              uStack_88 = uStack_9c;
              uStack_84 = uStack_9c;
              local_5c0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_560 + uVar98);
              local_620 = auVar188._0_32_;
              local_650.geometryUserPtr = pGVar11->userPtr;
              local_650.context = context->user;
              local_650.hit = local_1a0;
              local_650.N = 8;
              local_5e0 = auVar169._0_32_;
              local_650.ray = (RTCRayN *)ray;
              _local_600 = local_620;
              if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                auVar104 = ZEXT1632(auVar189._0_16_);
                (*pGVar11->intersectionFilterN)(&local_650);
                auVar104 = vpcmpeqd_avx2(auVar104,auVar104);
                auVar189 = ZEXT3264(auVar104);
                auVar188 = ZEXT3264(_local_600);
                auVar169 = ZEXT3264(local_5e0);
                auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar187 = ZEXT3264(auVar104);
              }
              if (local_620 == (undefined1  [32])0x0) {
LAB_01cec73f:
                auVar133 = ZEXT432((uint)local_5c0._0_4_);
                *(undefined4 *)(ray + k * 4 + 0x100) = local_5c0._0_4_;
              }
              else {
                p_Var13 = context->args->filter;
                if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  auVar104 = ZEXT1632(auVar189._0_16_);
                  (*p_Var13)(&local_650);
                  auVar104 = vpcmpeqd_avx2(auVar104,auVar104);
                  auVar189 = ZEXT3264(auVar104);
                  auVar188 = ZEXT3264(_local_600);
                  auVar169 = ZEXT3264(local_5e0);
                  auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar187 = ZEXT3264(auVar104);
                }
                if (local_620 == (undefined1  [32])0x0) goto LAB_01cec73f;
                uVar98 = vptestmd_avx512vl(local_620,local_620);
                iVar99 = *(int *)(local_650.hit + 4);
                iVar135 = *(int *)(local_650.hit + 8);
                iVar136 = *(int *)(local_650.hit + 0xc);
                iVar137 = *(int *)(local_650.hit + 0x10);
                iVar138 = *(int *)(local_650.hit + 0x14);
                iVar139 = *(int *)(local_650.hit + 0x18);
                iVar140 = *(int *)(local_650.hit + 0x1c);
                bVar90 = (byte)uVar98;
                bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar98 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar98 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar98 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar98 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar98 >> 6) & 1);
                bVar20 = SUB81(uVar98 >> 7,0);
                *(uint *)(local_650.ray + 0x180) =
                     (uint)(bVar90 & 1) * *(int *)local_650.hit |
                     (uint)!(bool)(bVar90 & 1) * *(int *)(local_650.ray + 0x180);
                *(uint *)(local_650.ray + 0x184) =
                     (uint)bVar14 * iVar99 | (uint)!bVar14 * *(int *)(local_650.ray + 0x184);
                *(uint *)(local_650.ray + 0x188) =
                     (uint)bVar15 * iVar135 | (uint)!bVar15 * *(int *)(local_650.ray + 0x188);
                *(uint *)(local_650.ray + 0x18c) =
                     (uint)bVar16 * iVar136 | (uint)!bVar16 * *(int *)(local_650.ray + 0x18c);
                *(uint *)(local_650.ray + 400) =
                     (uint)bVar17 * iVar137 | (uint)!bVar17 * *(int *)(local_650.ray + 400);
                *(uint *)(local_650.ray + 0x194) =
                     (uint)bVar18 * iVar138 | (uint)!bVar18 * *(int *)(local_650.ray + 0x194);
                *(uint *)(local_650.ray + 0x198) =
                     (uint)bVar19 * iVar139 | (uint)!bVar19 * *(int *)(local_650.ray + 0x198);
                *(uint *)(local_650.ray + 0x19c) =
                     (uint)bVar20 * iVar140 | (uint)!bVar20 * *(int *)(local_650.ray + 0x19c);
                iVar99 = *(int *)(local_650.hit + 0x24);
                iVar135 = *(int *)(local_650.hit + 0x28);
                iVar136 = *(int *)(local_650.hit + 0x2c);
                iVar137 = *(int *)(local_650.hit + 0x30);
                iVar138 = *(int *)(local_650.hit + 0x34);
                iVar139 = *(int *)(local_650.hit + 0x38);
                iVar140 = *(int *)(local_650.hit + 0x3c);
                bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar98 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar98 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar98 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar98 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar98 >> 6) & 1);
                bVar20 = SUB81(uVar98 >> 7,0);
                *(uint *)(local_650.ray + 0x1a0) =
                     (uint)(bVar90 & 1) * *(int *)(local_650.hit + 0x20) |
                     (uint)!(bool)(bVar90 & 1) * *(int *)(local_650.ray + 0x1a0);
                *(uint *)(local_650.ray + 0x1a4) =
                     (uint)bVar14 * iVar99 | (uint)!bVar14 * *(int *)(local_650.ray + 0x1a4);
                *(uint *)(local_650.ray + 0x1a8) =
                     (uint)bVar15 * iVar135 | (uint)!bVar15 * *(int *)(local_650.ray + 0x1a8);
                *(uint *)(local_650.ray + 0x1ac) =
                     (uint)bVar16 * iVar136 | (uint)!bVar16 * *(int *)(local_650.ray + 0x1ac);
                *(uint *)(local_650.ray + 0x1b0) =
                     (uint)bVar17 * iVar137 | (uint)!bVar17 * *(int *)(local_650.ray + 0x1b0);
                *(uint *)(local_650.ray + 0x1b4) =
                     (uint)bVar18 * iVar138 | (uint)!bVar18 * *(int *)(local_650.ray + 0x1b4);
                *(uint *)(local_650.ray + 0x1b8) =
                     (uint)bVar19 * iVar139 | (uint)!bVar19 * *(int *)(local_650.ray + 0x1b8);
                *(uint *)(local_650.ray + 0x1bc) =
                     (uint)bVar20 * iVar140 | (uint)!bVar20 * *(int *)(local_650.ray + 0x1bc);
                iVar99 = *(int *)(local_650.hit + 0x44);
                iVar135 = *(int *)(local_650.hit + 0x48);
                iVar136 = *(int *)(local_650.hit + 0x4c);
                iVar137 = *(int *)(local_650.hit + 0x50);
                iVar138 = *(int *)(local_650.hit + 0x54);
                iVar139 = *(int *)(local_650.hit + 0x58);
                iVar140 = *(int *)(local_650.hit + 0x5c);
                bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar98 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar98 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar98 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar98 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar98 >> 6) & 1);
                bVar20 = SUB81(uVar98 >> 7,0);
                *(uint *)(local_650.ray + 0x1c0) =
                     (uint)(bVar90 & 1) * *(int *)(local_650.hit + 0x40) |
                     (uint)!(bool)(bVar90 & 1) * *(int *)(local_650.ray + 0x1c0);
                *(uint *)(local_650.ray + 0x1c4) =
                     (uint)bVar14 * iVar99 | (uint)!bVar14 * *(int *)(local_650.ray + 0x1c4);
                *(uint *)(local_650.ray + 0x1c8) =
                     (uint)bVar15 * iVar135 | (uint)!bVar15 * *(int *)(local_650.ray + 0x1c8);
                *(uint *)(local_650.ray + 0x1cc) =
                     (uint)bVar16 * iVar136 | (uint)!bVar16 * *(int *)(local_650.ray + 0x1cc);
                *(uint *)(local_650.ray + 0x1d0) =
                     (uint)bVar17 * iVar137 | (uint)!bVar17 * *(int *)(local_650.ray + 0x1d0);
                *(uint *)(local_650.ray + 0x1d4) =
                     (uint)bVar18 * iVar138 | (uint)!bVar18 * *(int *)(local_650.ray + 0x1d4);
                *(uint *)(local_650.ray + 0x1d8) =
                     (uint)bVar19 * iVar139 | (uint)!bVar19 * *(int *)(local_650.ray + 0x1d8);
                *(uint *)(local_650.ray + 0x1dc) =
                     (uint)bVar20 * iVar140 | (uint)!bVar20 * *(int *)(local_650.ray + 0x1dc);
                iVar99 = *(int *)(local_650.hit + 100);
                iVar135 = *(int *)(local_650.hit + 0x68);
                iVar136 = *(int *)(local_650.hit + 0x6c);
                iVar137 = *(int *)(local_650.hit + 0x70);
                iVar138 = *(int *)(local_650.hit + 0x74);
                iVar139 = *(int *)(local_650.hit + 0x78);
                iVar140 = *(int *)(local_650.hit + 0x7c);
                bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar98 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar98 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar98 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar98 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar98 >> 6) & 1);
                bVar20 = SUB81(uVar98 >> 7,0);
                *(uint *)(local_650.ray + 0x1e0) =
                     (uint)(bVar90 & 1) * *(int *)(local_650.hit + 0x60) |
                     (uint)!(bool)(bVar90 & 1) * *(int *)(local_650.ray + 0x1e0);
                *(uint *)(local_650.ray + 0x1e4) =
                     (uint)bVar14 * iVar99 | (uint)!bVar14 * *(int *)(local_650.ray + 0x1e4);
                *(uint *)(local_650.ray + 0x1e8) =
                     (uint)bVar15 * iVar135 | (uint)!bVar15 * *(int *)(local_650.ray + 0x1e8);
                *(uint *)(local_650.ray + 0x1ec) =
                     (uint)bVar16 * iVar136 | (uint)!bVar16 * *(int *)(local_650.ray + 0x1ec);
                *(uint *)(local_650.ray + 0x1f0) =
                     (uint)bVar17 * iVar137 | (uint)!bVar17 * *(int *)(local_650.ray + 0x1f0);
                *(uint *)(local_650.ray + 500) =
                     (uint)bVar18 * iVar138 | (uint)!bVar18 * *(int *)(local_650.ray + 500);
                *(uint *)(local_650.ray + 0x1f8) =
                     (uint)bVar19 * iVar139 | (uint)!bVar19 * *(int *)(local_650.ray + 0x1f8);
                *(uint *)(local_650.ray + 0x1fc) =
                     (uint)bVar20 * iVar140 | (uint)!bVar20 * *(int *)(local_650.ray + 0x1fc);
                iVar99 = *(int *)(local_650.hit + 0x84);
                iVar135 = *(int *)(local_650.hit + 0x88);
                iVar136 = *(int *)(local_650.hit + 0x8c);
                iVar137 = *(int *)(local_650.hit + 0x90);
                iVar138 = *(int *)(local_650.hit + 0x94);
                iVar139 = *(int *)(local_650.hit + 0x98);
                iVar140 = *(int *)(local_650.hit + 0x9c);
                bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar98 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar98 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar98 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar98 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar98 >> 6) & 1);
                bVar20 = SUB81(uVar98 >> 7,0);
                *(uint *)(local_650.ray + 0x200) =
                     (uint)(bVar90 & 1) * *(int *)(local_650.hit + 0x80) |
                     (uint)!(bool)(bVar90 & 1) * *(int *)(local_650.ray + 0x200);
                *(uint *)(local_650.ray + 0x204) =
                     (uint)bVar14 * iVar99 | (uint)!bVar14 * *(int *)(local_650.ray + 0x204);
                *(uint *)(local_650.ray + 0x208) =
                     (uint)bVar15 * iVar135 | (uint)!bVar15 * *(int *)(local_650.ray + 0x208);
                *(uint *)(local_650.ray + 0x20c) =
                     (uint)bVar16 * iVar136 | (uint)!bVar16 * *(int *)(local_650.ray + 0x20c);
                *(uint *)(local_650.ray + 0x210) =
                     (uint)bVar17 * iVar137 | (uint)!bVar17 * *(int *)(local_650.ray + 0x210);
                *(uint *)(local_650.ray + 0x214) =
                     (uint)bVar18 * iVar138 | (uint)!bVar18 * *(int *)(local_650.ray + 0x214);
                *(uint *)(local_650.ray + 0x218) =
                     (uint)bVar19 * iVar139 | (uint)!bVar19 * *(int *)(local_650.ray + 0x218);
                *(uint *)(local_650.ray + 0x21c) =
                     (uint)bVar20 * iVar140 | (uint)!bVar20 * *(int *)(local_650.ray + 0x21c);
                auVar104 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xa0));
                *(undefined1 (*) [32])(local_650.ray + 0x220) = auVar104;
                auVar104 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xc0));
                *(undefined1 (*) [32])(local_650.ray + 0x240) = auVar104;
                auVar104 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xe0));
                *(undefined1 (*) [32])(local_650.ray + 0x260) = auVar104;
                auVar133 = *(undefined1 (*) [32])(local_650.hit + 0x100);
                auVar104 = vmovdqa32_avx512vl(auVar133);
                *(undefined1 (*) [32])(local_650.ray + 0x280) = auVar104;
              }
              uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar80._4_4_ = uVar4;
              auVar80._0_4_ = uVar4;
              auVar80._8_4_ = uVar4;
              auVar80._12_4_ = uVar4;
              auVar80._16_4_ = uVar4;
              auVar80._20_4_ = uVar4;
              auVar80._24_4_ = uVar4;
              auVar80._28_4_ = uVar4;
              uVar71 = vcmpps_avx512vl(auVar169._0_32_,auVar80,2);
              uVar95 = (uint)(byte)(~(byte)(1 << (uVar91 & 0x1f)) & (byte)uVar95) & (uint)uVar71;
              goto LAB_01cec43e;
            }
            bVar14 = false;
          }
          if (!bVar14) {
            uVar98 = (ulong)(uVar93 << 2);
            uVar4 = *(undefined4 *)((long)local_5a0 + uVar98);
            uVar5 = *(undefined4 *)(local_580 + uVar98);
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_560 + uVar98);
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)((long)local_540 + uVar98);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)((long)local_520 + uVar98);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)((long)local_500 + uVar98);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar4;
            *(undefined4 *)(ray + k * 4 + 0x200) = uVar5;
            *(undefined4 *)(ray + k * 4 + 0x220) =
                 *(undefined4 *)((long)&(line->primIDs).field_0 + uVar98);
            *(uint *)(ray + k * 4 + 0x240) = uVar92;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            return;
          }
          bVar90 = (byte)uVar95;
          if (bVar90 == 0) {
            return;
          }
          auVar104 = vblendmps_avx512vl(auVar187._0_32_,auVar169._0_32_);
          auVar134._0_4_ =
               (uint)(bVar90 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar133._0_4_;
          bVar14 = (bool)((byte)(uVar95 >> 1) & 1);
          auVar134._4_4_ = (uint)bVar14 * auVar104._4_4_ | (uint)!bVar14 * auVar133._4_4_;
          bVar14 = (bool)((byte)(uVar95 >> 2) & 1);
          auVar134._8_4_ = (uint)bVar14 * auVar104._8_4_ | (uint)!bVar14 * auVar133._8_4_;
          bVar14 = (bool)((byte)(uVar95 >> 3) & 1);
          auVar134._12_4_ = (uint)bVar14 * auVar104._12_4_ | (uint)!bVar14 * auVar133._12_4_;
          bVar14 = (bool)((byte)(uVar95 >> 4) & 1);
          auVar134._16_4_ = (uint)bVar14 * auVar104._16_4_ | (uint)!bVar14 * auVar133._16_4_;
          bVar14 = (bool)((byte)(uVar95 >> 5) & 1);
          auVar134._20_4_ = (uint)bVar14 * auVar104._20_4_ | (uint)!bVar14 * auVar133._20_4_;
          bVar14 = (bool)((byte)(uVar95 >> 6) & 1);
          auVar134._24_4_ = (uint)bVar14 * auVar104._24_4_ | (uint)!bVar14 * auVar133._24_4_;
          auVar134._28_4_ =
               (uVar95 >> 7) * auVar104._28_4_ | (uint)!SUB41(uVar95 >> 7,0) * auVar133._28_4_;
          auVar104 = vshufps_avx(auVar134,auVar134,0xb1);
          auVar104 = vminps_avx(auVar134,auVar104);
          auVar105 = vshufpd_avx(auVar104,auVar104,5);
          auVar104 = vminps_avx(auVar104,auVar105);
          auVar105 = vpermpd_avx2(auVar104,0x4e);
          auVar104 = vminps_avx(auVar104,auVar105);
          uVar71 = vcmpps_avx512vl(auVar134,auVar104,0);
          bVar90 = (byte)uVar71 & bVar90;
          uVar92 = uVar95;
          if (bVar90 != 0) {
            uVar92 = (uint)bVar90;
          }
          uVar91 = 0;
          for (; auVar133 = auVar134, (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
            uVar91 = uVar91 + 1;
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Intersect1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }